

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  BBox1f BVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  long lVar11;
  __int_type_conflict _Var12;
  long lVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [12];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined8 uVar62;
  undefined8 uVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  uint uVar71;
  uint uVar72;
  ulong uVar73;
  uint uVar74;
  long lVar75;
  byte bVar76;
  long lVar77;
  bool bVar78;
  uint uVar79;
  bool bVar80;
  float fVar81;
  float fVar82;
  vint4 bi;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar103 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar161;
  float fVar162;
  vint4 bi_1;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar163;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar137 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  vint4 bi_2;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  vint4 ai;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  float fVar217;
  float fVar235;
  float fVar236;
  vint4 ai_1;
  float fVar237;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar238;
  float fVar255;
  float fVar256;
  vint4 ai_2;
  float fVar257;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar258;
  float fVar271;
  float fVar272;
  vfloat4 b0;
  undefined1 auVar259 [16];
  float fVar273;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [32];
  vfloat4 a0_1;
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [32];
  float fVar303;
  float fVar304;
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  float fVar306;
  float fVar307;
  float fVar308;
  undefined1 auVar301 [32];
  float fVar305;
  undefined1 auVar302 [32];
  float fVar309;
  float fVar318;
  float fVar319;
  undefined1 auVar310 [16];
  float fVar320;
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [32];
  float fVar321;
  float fVar331;
  float fVar332;
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  float fVar333;
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [32];
  undefined1 auVar330 [64];
  float fVar334;
  float fVar340;
  float fVar341;
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  float fVar342;
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar351;
  float fVar352;
  float fVar353;
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  float fVar354;
  float fVar355;
  float fVar361;
  float fVar362;
  float fVar363;
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  float fVar364;
  float fVar365;
  float fVar370;
  float fVar372;
  vfloat4 a0;
  undefined1 auVar366 [16];
  float fVar375;
  undefined1 auVar367 [16];
  float fVar374;
  undefined1 auVar368 [16];
  float fVar371;
  float fVar373;
  float fVar376;
  undefined1 auVar369 [64];
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float fStack_5dc;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  undefined1 local_568 [8];
  float fStack_560;
  float fStack_55c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  vfloat_impl<4> p02;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined1 local_448 [16];
  undefined1 (*local_438) [16];
  Primitive *local_430;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  vfloat_impl<4> p03;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  BBox1f cu_stack [4];
  RTCHitN local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [16];
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  BBox1f cv_stack [4];
  undefined1 auVar270 [32];
  undefined1 auVar360 [32];
  
  PVar6 = prim[1];
  uVar73 = (ulong)(byte)PVar6;
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 4 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 5 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 6 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xf + 6)));
  lVar75 = uVar73 * 0x25;
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x11 + 6)));
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x1a + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x1b + 6)));
  auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar95 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar238 = *(float *)(prim + lVar75 + 0x12);
  auVar94 = vsubps_avx(auVar94,*(undefined1 (*) [16])(prim + lVar75 + 6));
  auVar193._0_4_ = fVar238 * auVar94._0_4_;
  auVar193._4_4_ = fVar238 * auVar94._4_4_;
  auVar193._8_4_ = fVar238 * auVar94._8_4_;
  auVar193._12_4_ = fVar238 * auVar94._12_4_;
  auVar322._0_4_ = fVar238 * auVar95._0_4_;
  auVar322._4_4_ = fVar238 * auVar95._4_4_;
  auVar322._8_4_ = fVar238 * auVar95._8_4_;
  auVar322._12_4_ = fVar238 * auVar95._12_4_;
  auVar132 = vcvtdq2ps_avx(auVar17);
  auVar15 = vcvtdq2ps_avx(auVar18);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x1c + 6)));
  auVar95 = vshufps_avx(auVar322,auVar322,0x55);
  auVar17 = vshufps_avx(auVar322,auVar322,0xaa);
  fVar217 = auVar17._0_4_;
  fVar235 = auVar17._4_4_;
  fVar236 = auVar17._8_4_;
  fVar237 = auVar17._12_4_;
  fVar256 = auVar95._0_4_;
  fVar272 = auVar95._4_4_;
  fVar257 = auVar95._8_4_;
  fVar273 = auVar95._12_4_;
  auVar16 = vcvtdq2ps_avx(auVar210);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar84 = vcvtdq2ps_avx(auVar94);
  auVar94 = vshufps_avx(auVar322,auVar322,0);
  fVar238 = auVar94._0_4_;
  fVar258 = auVar94._4_4_;
  fVar255 = auVar94._8_4_;
  fVar271 = auVar94._12_4_;
  auVar335._0_4_ = fVar256 * auVar132._0_4_ + fVar217 * auVar15._0_4_ + fVar238 * auVar16._0_4_;
  auVar335._4_4_ = fVar272 * auVar132._4_4_ + fVar235 * auVar15._4_4_ + fVar258 * auVar16._4_4_;
  auVar335._8_4_ = fVar257 * auVar132._8_4_ + fVar236 * auVar15._8_4_ + fVar255 * auVar16._8_4_;
  auVar335._12_4_ = fVar273 * auVar132._12_4_ + fVar237 * auVar15._12_4_ + fVar271 * auVar16._12_4_;
  auVar366._0_4_ = fVar238 * auVar19._0_4_ + fVar217 * auVar20._0_4_ + fVar256 * auVar93._0_4_;
  auVar366._4_4_ = fVar258 * auVar19._4_4_ + fVar235 * auVar20._4_4_ + fVar272 * auVar93._4_4_;
  auVar366._8_4_ = fVar255 * auVar19._8_4_ + fVar236 * auVar20._8_4_ + fVar257 * auVar93._8_4_;
  auVar366._12_4_ = fVar271 * auVar19._12_4_ + fVar237 * auVar20._12_4_ + fVar273 * auVar93._12_4_;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar73 * 7 + 6);
  auVar126 = vpmovsxwd_avx(auVar94);
  auVar94 = vcvtdq2ps_avx(auVar85);
  auVar179._0_4_ = fVar238 * auVar94._0_4_ + fVar256 * auVar21._0_4_ + fVar217 * auVar84._0_4_;
  auVar179._4_4_ = fVar258 * auVar94._4_4_ + fVar272 * auVar21._4_4_ + fVar235 * auVar84._4_4_;
  auVar179._8_4_ = fVar255 * auVar94._8_4_ + fVar257 * auVar21._8_4_ + fVar236 * auVar84._8_4_;
  auVar179._12_4_ = fVar271 * auVar94._12_4_ + fVar273 * auVar21._12_4_ + fVar237 * auVar84._12_4_;
  auVar95 = vshufps_avx(auVar193,auVar193,0xaa);
  fVar238 = auVar95._0_4_;
  fVar271 = auVar95._4_4_;
  fVar257 = auVar95._8_4_;
  fVar235 = auVar95._12_4_;
  auVar95 = vshufps_avx(auVar193,auVar193,0x55);
  fVar258 = auVar95._0_4_;
  fVar256 = auVar95._4_4_;
  fVar273 = auVar95._8_4_;
  fVar236 = auVar95._12_4_;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar73 * 0xb + 6);
  auVar85 = vpmovsxwd_avx(auVar95);
  auVar210._8_8_ = 0;
  auVar210._0_8_ = *(ulong *)(prim + uVar73 * 9 + 6);
  auVar165 = vpmovsxwd_avx(auVar210);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar73 * 0xd + 6);
  auVar17 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar73 * 0x12 + 6);
  auVar18 = vpmovsxwd_avx(auVar18);
  auVar95 = vshufps_avx(auVar193,auVar193,0);
  fVar255 = auVar95._0_4_;
  fVar272 = auVar95._4_4_;
  fVar217 = auVar95._8_4_;
  fVar237 = auVar95._12_4_;
  auVar83._0_4_ = auVar16._0_4_ * fVar255 + auVar132._0_4_ * fVar258 + auVar15._0_4_ * fVar238;
  auVar83._4_4_ = auVar16._4_4_ * fVar272 + auVar132._4_4_ * fVar256 + auVar15._4_4_ * fVar271;
  auVar83._8_4_ = auVar16._8_4_ * fVar217 + auVar132._8_4_ * fVar273 + auVar15._8_4_ * fVar257;
  auVar83._12_4_ = auVar16._12_4_ * fVar237 + auVar132._12_4_ * fVar236 + auVar15._12_4_ * fVar235;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *(ulong *)(prim + uVar73 * 0x16 + 6);
  auVar132 = vpmovsxwd_avx(auVar132);
  auVar125._0_4_ = fVar255 * auVar19._0_4_ + fVar258 * auVar93._0_4_ + auVar20._0_4_ * fVar238;
  auVar125._4_4_ = fVar272 * auVar19._4_4_ + fVar256 * auVar93._4_4_ + auVar20._4_4_ * fVar271;
  auVar125._8_4_ = fVar217 * auVar19._8_4_ + fVar273 * auVar93._8_4_ + auVar20._8_4_ * fVar257;
  auVar125._12_4_ = fVar237 * auVar19._12_4_ + fVar236 * auVar93._12_4_ + auVar20._12_4_ * fVar235;
  auVar164._0_4_ = auVar94._0_4_ * fVar255 + fVar258 * auVar21._0_4_ + fVar238 * auVar84._0_4_;
  auVar164._4_4_ = auVar94._4_4_ * fVar272 + fVar256 * auVar21._4_4_ + fVar271 * auVar84._4_4_;
  auVar164._8_4_ = auVar94._8_4_ * fVar217 + fVar273 * auVar21._8_4_ + fVar257 * auVar84._8_4_;
  auVar164._12_4_ = auVar94._12_4_ * fVar237 + fVar236 * auVar21._12_4_ + fVar235 * auVar84._12_4_;
  auVar274._8_4_ = 0x7fffffff;
  auVar274._0_8_ = 0x7fffffff7fffffff;
  auVar274._12_4_ = 0x7fffffff;
  auVar94 = vandps_avx(auVar335,auVar274);
  auVar151._8_4_ = 0x219392ef;
  auVar151._0_8_ = 0x219392ef219392ef;
  auVar151._12_4_ = 0x219392ef;
  auVar94 = vcmpps_avx(auVar94,auVar151,1);
  auVar95 = vblendvps_avx(auVar335,auVar151,auVar94);
  auVar94 = vandps_avx(auVar366,auVar274);
  auVar94 = vcmpps_avx(auVar94,auVar151,1);
  auVar210 = vblendvps_avx(auVar366,auVar151,auVar94);
  auVar94 = vandps_avx(auVar179,auVar274);
  auVar94 = vcmpps_avx(auVar94,auVar151,1);
  auVar94 = vblendvps_avx(auVar179,auVar151,auVar94);
  auVar15 = vrcpps_avx(auVar95);
  fVar217 = auVar15._0_4_;
  auVar198._0_4_ = fVar217 * auVar95._0_4_;
  fVar235 = auVar15._4_4_;
  auVar198._4_4_ = fVar235 * auVar95._4_4_;
  fVar236 = auVar15._8_4_;
  auVar198._8_4_ = fVar236 * auVar95._8_4_;
  fVar237 = auVar15._12_4_;
  auVar198._12_4_ = fVar237 * auVar95._12_4_;
  auVar336._8_4_ = 0x3f800000;
  auVar336._0_8_ = 0x3f8000003f800000;
  auVar336._12_4_ = 0x3f800000;
  auVar95 = vsubps_avx(auVar336,auVar198);
  fVar217 = fVar217 + fVar217 * auVar95._0_4_;
  fVar235 = fVar235 + fVar235 * auVar95._4_4_;
  fVar236 = fVar236 + fVar236 * auVar95._8_4_;
  fVar237 = fVar237 + fVar237 * auVar95._12_4_;
  auVar95 = vrcpps_avx(auVar210);
  fVar238 = auVar95._0_4_;
  auVar140._0_4_ = fVar238 * auVar210._0_4_;
  fVar255 = auVar95._4_4_;
  auVar140._4_4_ = fVar255 * auVar210._4_4_;
  fVar256 = auVar95._8_4_;
  auVar140._8_4_ = fVar256 * auVar210._8_4_;
  fVar257 = auVar95._12_4_;
  auVar140._12_4_ = fVar257 * auVar210._12_4_;
  auVar95 = vsubps_avx(auVar336,auVar140);
  fVar238 = fVar238 + fVar238 * auVar95._0_4_;
  fVar255 = fVar255 + fVar255 * auVar95._4_4_;
  fVar256 = fVar256 + fVar256 * auVar95._8_4_;
  fVar257 = fVar257 + fVar257 * auVar95._12_4_;
  auVar95 = vrcpps_avx(auVar94);
  fVar258 = auVar95._0_4_;
  auVar259._0_4_ = fVar258 * auVar94._0_4_;
  fVar271 = auVar95._4_4_;
  auVar259._4_4_ = fVar271 * auVar94._4_4_;
  fVar272 = auVar95._8_4_;
  auVar259._8_4_ = fVar272 * auVar94._8_4_;
  fVar273 = auVar95._12_4_;
  auVar259._12_4_ = fVar273 * auVar94._12_4_;
  auVar94 = vsubps_avx(auVar336,auVar259);
  fVar258 = fVar258 + fVar258 * auVar94._0_4_;
  fVar271 = fVar271 + fVar271 * auVar94._4_4_;
  fVar272 = fVar272 + fVar272 * auVar94._8_4_;
  fVar273 = fVar273 + fVar273 * auVar94._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar73 * 0x14 + 6);
  auVar210 = vpmovsxwd_avx(auVar15);
  auVar15 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) -
                                         *(float *)(prim + lVar75 + 0x16)) *
                                        *(float *)(prim + lVar75 + 0x1a))),0);
  auVar94 = vcvtdq2ps_avx(auVar126);
  auVar95 = vcvtdq2ps_avx(auVar85);
  auVar95 = vsubps_avx(auVar95,auVar94);
  fVar161 = auVar15._0_4_;
  fVar162 = auVar15._4_4_;
  fVar81 = auVar15._8_4_;
  fVar82 = auVar15._12_4_;
  auVar107._0_4_ = fVar161 * auVar95._0_4_ + auVar94._0_4_;
  auVar107._4_4_ = fVar162 * auVar95._4_4_ + auVar94._4_4_;
  auVar107._8_4_ = fVar81 * auVar95._8_4_ + auVar94._8_4_;
  auVar107._12_4_ = fVar82 * auVar95._12_4_ + auVar94._12_4_;
  auVar94 = vcvtdq2ps_avx(auVar165);
  auVar95 = vcvtdq2ps_avx(auVar17);
  auVar95 = vsubps_avx(auVar95,auVar94);
  auVar275._0_4_ = fVar161 * auVar95._0_4_ + auVar94._0_4_;
  auVar275._4_4_ = fVar162 * auVar95._4_4_ + auVar94._4_4_;
  auVar275._8_4_ = fVar81 * auVar95._8_4_ + auVar94._8_4_;
  auVar275._12_4_ = fVar82 * auVar95._12_4_ + auVar94._12_4_;
  auVar94 = vcvtdq2ps_avx(auVar18);
  auVar95 = vcvtdq2ps_avx(auVar132);
  auVar95 = vsubps_avx(auVar95,auVar94);
  auVar282._0_4_ = fVar161 * auVar95._0_4_ + auVar94._0_4_;
  auVar282._4_4_ = fVar162 * auVar95._4_4_ + auVar94._4_4_;
  auVar282._8_4_ = fVar81 * auVar95._8_4_ + auVar94._8_4_;
  auVar282._12_4_ = fVar82 * auVar95._12_4_ + auVar94._12_4_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar73 * 0x18 + 6);
  auVar95 = vpmovsxwd_avx(auVar93);
  auVar94 = vcvtdq2ps_avx(auVar210);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar94);
  auVar296._0_4_ = fVar161 * auVar95._0_4_ + auVar94._0_4_;
  auVar296._4_4_ = fVar162 * auVar95._4_4_ + auVar94._4_4_;
  auVar296._8_4_ = fVar81 * auVar95._8_4_ + auVar94._8_4_;
  auVar296._12_4_ = fVar82 * auVar95._12_4_ + auVar94._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar73 * 0x1d + 6);
  auVar94 = vpmovsxwd_avx(auVar20);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar73 * 0x21 + 6);
  auVar95 = vpmovsxwd_avx(auVar16);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar94);
  auVar310._0_4_ = fVar161 * auVar95._0_4_ + auVar94._0_4_;
  auVar310._4_4_ = fVar162 * auVar95._4_4_ + auVar94._4_4_;
  auVar310._8_4_ = fVar81 * auVar95._8_4_ + auVar94._8_4_;
  auVar310._12_4_ = fVar82 * auVar95._12_4_ + auVar94._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar73 * 0x1f + 6);
  auVar94 = vpmovsxwd_avx(auVar19);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar73 * 0x23 + 6);
  auVar95 = vpmovsxwd_avx(auVar21);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar94);
  auVar323._0_4_ = fVar161 * auVar95._0_4_ + auVar94._0_4_;
  auVar323._4_4_ = fVar162 * auVar95._4_4_ + auVar94._4_4_;
  auVar323._8_4_ = fVar81 * auVar95._8_4_ + auVar94._8_4_;
  auVar323._12_4_ = fVar82 * auVar95._12_4_ + auVar94._12_4_;
  auVar94 = vsubps_avx(auVar107,auVar83);
  auVar199._0_4_ = fVar217 * auVar94._0_4_;
  auVar199._4_4_ = fVar235 * auVar94._4_4_;
  auVar199._8_4_ = fVar236 * auVar94._8_4_;
  auVar199._12_4_ = fVar237 * auVar94._12_4_;
  auVar94 = vsubps_avx(auVar275,auVar83);
  auVar84._0_4_ = fVar217 * auVar94._0_4_;
  auVar84._4_4_ = fVar235 * auVar94._4_4_;
  auVar84._8_4_ = fVar236 * auVar94._8_4_;
  auVar84._12_4_ = fVar237 * auVar94._12_4_;
  auVar94 = vsubps_avx(auVar282,auVar125);
  auVar139._0_4_ = fVar238 * auVar94._0_4_;
  auVar139._4_4_ = fVar255 * auVar94._4_4_;
  auVar139._8_4_ = fVar256 * auVar94._8_4_;
  auVar139._12_4_ = fVar257 * auVar94._12_4_;
  auVar94 = vsubps_avx(auVar296,auVar125);
  auVar126._0_4_ = fVar238 * auVar94._0_4_;
  auVar126._4_4_ = fVar255 * auVar94._4_4_;
  auVar126._8_4_ = fVar256 * auVar94._8_4_;
  auVar126._12_4_ = fVar257 * auVar94._12_4_;
  auVar94 = vsubps_avx(auVar310,auVar164);
  auVar239._0_4_ = fVar258 * auVar94._0_4_;
  auVar239._4_4_ = fVar271 * auVar94._4_4_;
  auVar239._8_4_ = fVar272 * auVar94._8_4_;
  auVar239._12_4_ = fVar273 * auVar94._12_4_;
  auVar94 = vsubps_avx(auVar323,auVar164);
  auVar165._0_4_ = fVar258 * auVar94._0_4_;
  auVar165._4_4_ = fVar271 * auVar94._4_4_;
  auVar165._8_4_ = fVar272 * auVar94._8_4_;
  auVar165._12_4_ = fVar273 * auVar94._12_4_;
  auVar94 = vpminsd_avx(auVar199,auVar84);
  auVar95 = vpminsd_avx(auVar139,auVar126);
  auVar94 = vmaxps_avx(auVar94,auVar95);
  auVar95 = vpminsd_avx(auVar239,auVar165);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar283._4_4_ = uVar4;
  auVar283._0_4_ = uVar4;
  auVar283._8_4_ = uVar4;
  auVar283._12_4_ = uVar4;
  auVar95 = vmaxps_avx(auVar95,auVar283);
  auVar94 = vmaxps_avx(auVar94,auVar95);
  auVar260._0_4_ = auVar94._0_4_ * 0.99999964;
  auVar260._4_4_ = auVar94._4_4_ * 0.99999964;
  auVar260._8_4_ = auVar94._8_4_ * 0.99999964;
  auVar260._12_4_ = auVar94._12_4_ * 0.99999964;
  auVar94 = vpmaxsd_avx(auVar199,auVar84);
  auVar95 = vpmaxsd_avx(auVar139,auVar126);
  auVar94 = vminps_avx(auVar94,auVar95);
  auVar95 = vpmaxsd_avx(auVar239,auVar165);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar166._4_4_ = uVar4;
  auVar166._0_4_ = uVar4;
  auVar166._8_4_ = uVar4;
  auVar166._12_4_ = uVar4;
  auVar95 = vminps_avx(auVar95,auVar166);
  auVar94 = vminps_avx(auVar94,auVar95);
  auVar95 = vpshufd_avx(ZEXT116((byte)PVar6),0);
  auVar95 = vpcmpgtd_avx(auVar95,_DAT_01f4ad30);
  auVar85._0_4_ = auVar94._0_4_ * 1.0000004;
  auVar85._4_4_ = auVar94._4_4_ * 1.0000004;
  auVar85._8_4_ = auVar94._8_4_ * 1.0000004;
  auVar85._12_4_ = auVar94._12_4_ * 1.0000004;
  auVar94 = vcmpps_avx(auVar260,auVar85,2);
  auVar94 = vandps_avx(auVar94,auVar95);
  uVar79 = vmovmskps_avx(auVar94);
  auVar119._16_16_ = mm_lookupmask_ps._240_16_;
  auVar119._0_16_ = mm_lookupmask_ps._240_16_;
  local_178 = vblendps_avx(auVar119,ZEXT832(0) << 0x20,0x80);
  local_438 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar59 = ZEXT412(0);
  local_430 = prim;
LAB_00919ac2:
  auVar61._12_4_ = 0;
  auVar61._0_12_ = auVar59;
  if (uVar79 == 0) {
LAB_0091bdc3:
    return uVar79 != 0;
  }
  lVar75 = 0;
  if (uVar79 != 0) {
    for (; (uVar79 >> lVar75 & 1) == 0; lVar75 = lVar75 + 1) {
    }
  }
  uVar72 = *(uint *)(local_430 + 2);
  uVar71 = *(uint *)(local_430 + lVar75 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar72].ptr;
  fVar238 = (pGVar7->time_range).lower;
  fVar217 = pGVar7->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar238) / ((pGVar7->time_range).upper - fVar238));
  auVar94 = vroundss_avx(ZEXT416((uint)fVar217),ZEXT416((uint)fVar217),9);
  auVar94 = vminss_avx(auVar94,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar210 = vmaxss_avx(auVar61 << 0x20,auVar94);
  uVar73 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)uVar71 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar77 = (long)(int)auVar210._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + 0x10 + lVar77);
  pfVar1 = (float *)(*(long *)(_Var8 + lVar77) + lVar9 * uVar73);
  fVar235 = *pfVar1;
  fVar236 = pfVar1[1];
  fVar237 = pfVar1[2];
  fVar161 = pfVar1[3];
  lVar75 = uVar73 + 1;
  auVar94 = *(undefined1 (*) [16])(*(long *)(_Var8 + lVar77) + lVar9 * lVar75);
  p_Var10 = pGVar7[4].occlusionFilterN;
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar9 + 0x10 + lVar77);
  pfVar1 = (float *)(*(long *)(lVar9 + lVar77) + lVar11 * uVar73);
  fVar162 = *pfVar1;
  fVar81 = pfVar1[1];
  fVar82 = pfVar1[2];
  fVar163 = pfVar1[3];
  _Var12 = pGVar7[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(*(long *)(p_Var10 + lVar77) + *(long *)(p_Var10 + lVar77 + 0x10) * uVar73);
  pfVar2 = (float *)(*(long *)(p_Var10 + lVar77) + *(long *)(p_Var10 + lVar77 + 0x10) * lVar75);
  auVar276._0_4_ = *pfVar2 * 0.33333334;
  auVar276._4_4_ = pfVar2[1] * 0.33333334;
  auVar276._8_4_ = pfVar2[2] * 0.33333334;
  auVar276._12_4_ = pfVar2[3] * 0.33333334;
  lVar13 = *(long *)(_Var12 + 0x10 + lVar77);
  pfVar2 = (float *)(*(long *)(_Var12 + lVar77) + lVar13 * uVar73);
  auVar95 = *(undefined1 (*) [16])(*(long *)(lVar9 + lVar77) + lVar11 * lVar75);
  fVar217 = fVar217 - auVar210._0_4_;
  fVar321 = fVar235 + *pfVar1 * 0.33333334;
  fVar331 = fVar236 + pfVar1[1] * 0.33333334;
  fVar332 = fVar237 + pfVar1[2] * 0.33333334;
  fVar333 = fVar161 + pfVar1[3] * 0.33333334;
  auVar210 = vsubps_avx(auVar94,auVar276);
  fVar309 = *pfVar2 * 0.33333334 + fVar162;
  fVar318 = pfVar2[1] * 0.33333334 + fVar81;
  fVar319 = pfVar2[2] * 0.33333334 + fVar82;
  fVar320 = pfVar2[3] * 0.33333334 + fVar163;
  pfVar1 = (float *)(*(long *)(_Var12 + lVar77) + lVar13 * lVar75);
  auVar86._0_4_ = *pfVar1 * 0.33333334;
  auVar86._4_4_ = pfVar1[1] * 0.33333334;
  auVar86._8_4_ = pfVar1[2] * 0.33333334;
  auVar86._12_4_ = pfVar1[3] * 0.33333334;
  auVar17 = vsubps_avx(auVar95,auVar86);
  fVar238 = auVar94._0_4_;
  fVar255 = auVar94._4_4_;
  fVar256 = auVar94._8_4_;
  fVar257 = auVar94._12_4_;
  fVar334 = auVar210._0_4_ * 0.0;
  fVar340 = auVar210._4_4_ * 0.0;
  fVar341 = auVar210._8_4_ * 0.0;
  fVar342 = auVar210._12_4_ * 0.0;
  fVar355 = fVar334 + fVar238 * 0.0;
  fVar361 = fVar340 + fVar255 * 0.0;
  fVar362 = fVar341 + fVar256 * 0.0;
  fVar363 = fVar342 + fVar257 * 0.0;
  auVar87._0_4_ = fVar355 + fVar321 * 3.0;
  auVar87._4_4_ = fVar361 + fVar331 * 3.0;
  auVar87._8_4_ = fVar362 + fVar332 * 3.0;
  auVar87._12_4_ = fVar363 + fVar333 * 3.0;
  auVar127._0_4_ = fVar235 * 3.0;
  auVar127._4_4_ = fVar236 * 3.0;
  auVar127._8_4_ = fVar237 * 3.0;
  auVar127._12_4_ = fVar161 * 3.0;
  auVar20 = vsubps_avx(auVar87,auVar127);
  fVar258 = auVar95._0_4_;
  fVar271 = auVar95._4_4_;
  fVar272 = auVar95._8_4_;
  fVar273 = auVar95._12_4_;
  fVar347 = auVar17._0_4_ * 0.0;
  fVar351 = auVar17._4_4_ * 0.0;
  fVar352 = auVar17._8_4_ * 0.0;
  fVar353 = auVar17._12_4_ * 0.0;
  fVar364 = fVar347 + fVar258 * 0.0;
  fVar370 = fVar351 + fVar271 * 0.0;
  fVar372 = fVar352 + fVar272 * 0.0;
  fVar375 = fVar353 + fVar273 * 0.0;
  auVar88._0_4_ = fVar364 + fVar309 * 3.0;
  auVar88._4_4_ = fVar370 + fVar318 * 3.0;
  auVar88._8_4_ = fVar372 + fVar319 * 3.0;
  auVar88._12_4_ = fVar375 + fVar320 * 3.0;
  auVar284._0_4_ = fVar162 * 3.0;
  auVar284._4_4_ = fVar81 * 3.0;
  auVar284._8_4_ = fVar82 * 3.0;
  auVar284._12_4_ = fVar163 * 3.0;
  auVar18 = vsubps_avx(auVar88,auVar284);
  lVar11 = *(long *)(_Var8 + 0x38 + lVar77);
  lVar13 = *(long *)(_Var8 + 0x48 + lVar77);
  puVar3 = (undefined8 *)(lVar11 + lVar13 * uVar73);
  uVar62 = *puVar3;
  uVar63 = puVar3[1];
  fVar321 = fVar321 * 0.0;
  fVar331 = fVar331 * 0.0;
  fVar332 = fVar332 * 0.0;
  fVar333 = fVar333 * 0.0;
  auVar324._0_4_ = fVar355 + fVar321 + fVar235;
  auVar324._4_4_ = fVar361 + fVar331 + fVar236;
  auVar324._8_4_ = fVar362 + fVar332 + fVar237;
  auVar324._12_4_ = fVar363 + fVar333 + fVar161;
  fVar309 = fVar309 * 0.0;
  fVar318 = fVar318 * 0.0;
  fVar319 = fVar319 * 0.0;
  fVar320 = fVar320 * 0.0;
  auVar367._0_4_ = fVar309 + fVar364 + fVar162;
  auVar367._4_4_ = fVar318 + fVar370 + fVar81;
  auVar367._8_4_ = fVar319 + fVar372 + fVar82;
  auVar367._12_4_ = fVar320 + fVar375 + fVar163;
  auVar167._0_4_ = fVar235 * 0.0;
  auVar167._4_4_ = fVar236 * 0.0;
  auVar167._8_4_ = fVar237 * 0.0;
  auVar167._12_4_ = fVar161 * 0.0;
  auVar311._0_4_ = fVar334 + fVar238 + fVar321 + auVar167._0_4_;
  auVar311._4_4_ = fVar340 + fVar255 + fVar331 + auVar167._4_4_;
  auVar311._8_4_ = fVar341 + fVar256 + fVar332 + auVar167._8_4_;
  auVar311._12_4_ = fVar342 + fVar257 + fVar333 + auVar167._12_4_;
  auVar200._0_4_ = fVar238 * 3.0;
  auVar200._4_4_ = fVar255 * 3.0;
  auVar200._8_4_ = fVar256 * 3.0;
  auVar200._12_4_ = fVar257 * 3.0;
  auVar277._0_4_ = auVar210._0_4_ * 3.0;
  auVar277._4_4_ = auVar210._4_4_ * 3.0;
  auVar277._8_4_ = auVar210._8_4_ * 3.0;
  auVar277._12_4_ = auVar210._12_4_ * 3.0;
  auVar94 = vsubps_avx(auVar200,auVar277);
  auVar89._0_4_ = fVar321 + auVar94._0_4_;
  auVar89._4_4_ = fVar331 + auVar94._4_4_;
  auVar89._8_4_ = fVar332 + auVar94._8_4_;
  auVar89._12_4_ = fVar333 + auVar94._12_4_;
  auVar16 = vsubps_avx(auVar89,auVar167);
  auVar168._0_4_ = fVar162 * 0.0;
  auVar168._4_4_ = fVar81 * 0.0;
  auVar168._8_4_ = fVar82 * 0.0;
  auVar168._12_4_ = fVar163 * 0.0;
  auVar90._0_4_ = auVar168._0_4_ + fVar309 + fVar347 + fVar258;
  auVar90._4_4_ = auVar168._4_4_ + fVar318 + fVar351 + fVar271;
  auVar90._8_4_ = auVar168._8_4_ + fVar319 + fVar352 + fVar272;
  auVar90._12_4_ = auVar168._12_4_ + fVar320 + fVar353 + fVar273;
  auVar201._0_4_ = fVar258 * 3.0;
  auVar201._4_4_ = fVar271 * 3.0;
  auVar201._8_4_ = fVar272 * 3.0;
  auVar201._12_4_ = fVar273 * 3.0;
  auVar218._0_4_ = auVar17._0_4_ * 3.0;
  auVar218._4_4_ = auVar17._4_4_ * 3.0;
  auVar218._8_4_ = auVar17._8_4_ * 3.0;
  auVar218._12_4_ = auVar17._12_4_ * 3.0;
  auVar94 = vsubps_avx(auVar201,auVar218);
  auVar202._0_4_ = fVar309 + auVar94._0_4_;
  auVar202._4_4_ = fVar318 + auVar94._4_4_;
  auVar202._8_4_ = fVar319 + auVar94._8_4_;
  auVar202._12_4_ = fVar320 + auVar94._12_4_;
  auVar132 = vsubps_avx(auVar202,auVar168);
  auVar94 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar95 = vshufps_avx(auVar367,auVar367,0xc9);
  fVar235 = auVar20._0_4_;
  auVar219._0_4_ = fVar235 * auVar95._0_4_;
  fVar237 = auVar20._4_4_;
  auVar219._4_4_ = fVar237 * auVar95._4_4_;
  fVar81 = auVar20._8_4_;
  auVar219._8_4_ = fVar81 * auVar95._8_4_;
  fVar82 = auVar20._12_4_;
  auVar219._12_4_ = fVar82 * auVar95._12_4_;
  auVar240._0_4_ = auVar367._0_4_ * auVar94._0_4_;
  auVar240._4_4_ = auVar367._4_4_ * auVar94._4_4_;
  auVar240._8_4_ = auVar367._8_4_ * auVar94._8_4_;
  auVar240._12_4_ = auVar367._12_4_ * auVar94._12_4_;
  auVar95 = vsubps_avx(auVar240,auVar219);
  auVar210 = vshufps_avx(auVar95,auVar95,0xc9);
  auVar95 = vshufps_avx(auVar18,auVar18,0xc9);
  auVar241._0_4_ = fVar235 * auVar95._0_4_;
  auVar241._4_4_ = fVar237 * auVar95._4_4_;
  auVar241._8_4_ = fVar81 * auVar95._8_4_;
  auVar241._12_4_ = fVar82 * auVar95._12_4_;
  auVar169._0_4_ = auVar18._0_4_ * auVar94._0_4_;
  auVar169._4_4_ = auVar18._4_4_ * auVar94._4_4_;
  auVar169._8_4_ = auVar18._8_4_ * auVar94._8_4_;
  auVar169._12_4_ = auVar18._12_4_ * auVar94._12_4_;
  auVar94 = vsubps_avx(auVar169,auVar241);
  auVar17 = vshufps_avx(auVar94,auVar94,0xc9);
  auVar94 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar95 = vshufps_avx(auVar90,auVar90,0xc9);
  fVar355 = auVar16._0_4_;
  auVar170._0_4_ = fVar355 * auVar95._0_4_;
  fVar361 = auVar16._4_4_;
  auVar170._4_4_ = fVar361 * auVar95._4_4_;
  fVar362 = auVar16._8_4_;
  auVar170._8_4_ = fVar362 * auVar95._8_4_;
  fVar363 = auVar16._12_4_;
  auVar170._12_4_ = fVar363 * auVar95._12_4_;
  auVar91._0_4_ = auVar94._0_4_ * auVar90._0_4_;
  auVar91._4_4_ = auVar94._4_4_ * auVar90._4_4_;
  auVar91._8_4_ = auVar94._8_4_ * auVar90._8_4_;
  auVar91._12_4_ = auVar94._12_4_ * auVar90._12_4_;
  auVar95 = vsubps_avx(auVar91,auVar170);
  auVar18 = vshufps_avx(auVar95,auVar95,0xc9);
  auVar95 = vshufps_avx(auVar132,auVar132,0xc9);
  auVar92._0_4_ = fVar355 * auVar95._0_4_;
  auVar92._4_4_ = fVar361 * auVar95._4_4_;
  auVar92._8_4_ = fVar362 * auVar95._8_4_;
  auVar92._12_4_ = fVar363 * auVar95._12_4_;
  auVar203._0_4_ = auVar94._0_4_ * auVar132._0_4_;
  auVar203._4_4_ = auVar94._4_4_ * auVar132._4_4_;
  auVar203._8_4_ = auVar94._8_4_ * auVar132._8_4_;
  auVar203._12_4_ = auVar94._12_4_ * auVar132._12_4_;
  auVar94 = vdpps_avx(auVar210,auVar210,0x7f);
  auVar95 = vsubps_avx(auVar203,auVar92);
  auVar132 = vshufps_avx(auVar95,auVar95,0xc9);
  fVar258 = auVar94._0_4_;
  auVar93 = ZEXT416((uint)fVar258);
  auVar95 = vrsqrtss_avx(auVar93,auVar93);
  fVar238 = auVar95._0_4_;
  auVar95 = ZEXT416((uint)(fVar238 * 1.5 - fVar258 * 0.5 * fVar238 * fVar238 * fVar238));
  auVar15 = vshufps_avx(auVar95,auVar95,0);
  fVar256 = auVar15._0_4_ * auVar210._0_4_;
  fVar272 = auVar15._4_4_ * auVar210._4_4_;
  fVar257 = auVar15._8_4_ * auVar210._8_4_;
  fVar273 = auVar15._12_4_ * auVar210._12_4_;
  auVar95 = vdpps_avx(auVar210,auVar17,0x7f);
  auVar94 = vshufps_avx(auVar94,auVar94,0);
  auVar242._0_4_ = auVar94._0_4_ * auVar17._0_4_;
  auVar242._4_4_ = auVar94._4_4_ * auVar17._4_4_;
  auVar242._8_4_ = auVar94._8_4_ * auVar17._8_4_;
  auVar242._12_4_ = auVar94._12_4_ * auVar17._12_4_;
  auVar94 = vshufps_avx(auVar95,auVar95,0);
  auVar220._0_4_ = auVar94._0_4_ * auVar210._0_4_;
  auVar220._4_4_ = auVar94._4_4_ * auVar210._4_4_;
  auVar220._8_4_ = auVar94._8_4_ * auVar210._8_4_;
  auVar220._12_4_ = auVar94._12_4_ * auVar210._12_4_;
  auVar19 = vsubps_avx(auVar242,auVar220);
  auVar94 = vrcpss_avx(auVar93,auVar93);
  auVar94 = ZEXT416((uint)(auVar94._0_4_ * (2.0 - fVar258 * auVar94._0_4_)));
  auVar93 = vshufps_avx(auVar94,auVar94,0);
  auVar210 = vdpps_avx(auVar18,auVar18,0x7f);
  auVar95 = vblendps_avx(auVar210,_DAT_01f45a50,0xe);
  auVar94 = vrsqrtss_avx(auVar95,auVar95);
  fVar238 = auVar94._0_4_;
  auVar17 = vdpps_avx(auVar18,auVar132,0x7f);
  auVar94 = vshufps_avx(auVar210,auVar210,0);
  auVar261._0_4_ = auVar94._0_4_ * auVar132._0_4_;
  auVar261._4_4_ = auVar94._4_4_ * auVar132._4_4_;
  auVar261._8_4_ = auVar94._8_4_ * auVar132._8_4_;
  auVar261._12_4_ = auVar94._12_4_ * auVar132._12_4_;
  auVar94 = *(undefined1 (*) [16])(lVar11 + lVar13 * lVar75);
  pfVar1 = (float *)(*(long *)(p_Var10 + lVar77 + 0x38) +
                    *(long *)(p_Var10 + lVar77 + 0x48) * uVar73);
  auVar132 = ZEXT416((uint)(fVar238 * 1.5 - auVar210._0_4_ * 0.5 * fVar238 * fVar238 * fVar238));
  auVar132 = vshufps_avx(auVar132,auVar132,0);
  auVar17 = vshufps_avx(auVar17,auVar17,0);
  auVar285._0_4_ = auVar17._0_4_ * auVar18._0_4_;
  auVar285._4_4_ = auVar17._4_4_ * auVar18._4_4_;
  auVar285._8_4_ = auVar17._8_4_ * auVar18._8_4_;
  auVar285._12_4_ = auVar17._12_4_ * auVar18._12_4_;
  fVar238 = auVar18._0_4_ * auVar132._0_4_;
  fVar258 = auVar18._4_4_ * auVar132._4_4_;
  fVar255 = auVar18._8_4_ * auVar132._8_4_;
  fVar271 = auVar18._12_4_ * auVar132._12_4_;
  auVar18 = vsubps_avx(auVar261,auVar285);
  auVar95 = vrcpss_avx(auVar95,auVar95);
  auVar95 = ZEXT416((uint)(auVar95._0_4_ * (2.0 - auVar210._0_4_ * auVar95._0_4_)));
  auVar95 = vshufps_avx(auVar95,auVar95,0);
  auVar210 = vshufps_avx(auVar324,auVar324,0xff);
  auVar278._0_4_ = auVar210._0_4_ * fVar256;
  auVar278._4_4_ = auVar210._4_4_ * fVar272;
  auVar278._8_4_ = auVar210._8_4_ * fVar257;
  auVar278._12_4_ = auVar210._12_4_ * fVar273;
  auVar21 = vsubps_avx(auVar324,auVar278);
  auVar17 = vshufps_avx(auVar20,auVar20,0xff);
  auVar204._0_4_ =
       auVar17._0_4_ * fVar256 + auVar210._0_4_ * auVar15._0_4_ * auVar93._0_4_ * auVar19._0_4_;
  auVar204._4_4_ =
       auVar17._4_4_ * fVar272 + auVar210._4_4_ * auVar15._4_4_ * auVar93._4_4_ * auVar19._4_4_;
  auVar204._8_4_ =
       auVar17._8_4_ * fVar257 + auVar210._8_4_ * auVar15._8_4_ * auVar93._8_4_ * auVar19._8_4_;
  auVar204._12_4_ =
       auVar17._12_4_ * fVar273 + auVar210._12_4_ * auVar15._12_4_ * auVar93._12_4_ * auVar19._12_4_
  ;
  auVar15 = vsubps_avx(auVar20,auVar204);
  auVar210 = vshufps_avx(auVar311,auVar311,0xff);
  auVar243._0_4_ = auVar210._0_4_ * fVar238;
  auVar243._4_4_ = auVar210._4_4_ * fVar258;
  auVar243._8_4_ = auVar210._8_4_ * fVar255;
  auVar243._12_4_ = auVar210._12_4_ * fVar271;
  auVar93 = vsubps_avx(auVar311,auVar243);
  auVar17 = vshufps_avx(auVar16,auVar16,0xff);
  auVar96._0_4_ =
       auVar17._0_4_ * fVar238 + auVar210._0_4_ * auVar132._0_4_ * auVar18._0_4_ * auVar95._0_4_;
  auVar96._4_4_ =
       auVar17._4_4_ * fVar258 + auVar210._4_4_ * auVar132._4_4_ * auVar18._4_4_ * auVar95._4_4_;
  auVar96._8_4_ =
       auVar17._8_4_ * fVar255 + auVar210._8_4_ * auVar132._8_4_ * auVar18._8_4_ * auVar95._8_4_;
  auVar96._12_4_ =
       auVar17._12_4_ * fVar271 +
       auVar210._12_4_ * auVar132._12_4_ * auVar18._12_4_ * auVar95._12_4_;
  auVar20 = vsubps_avx(auVar16,auVar96);
  local_568._4_4_ = auVar311._4_4_ + auVar243._4_4_;
  local_568._0_4_ = auVar311._0_4_ + auVar243._0_4_;
  fStack_560 = auVar311._8_4_ + auVar243._8_4_;
  fStack_55c = auVar311._12_4_ + auVar243._12_4_;
  local_5e8 = (float)uVar62;
  fStack_5e4 = (float)((ulong)uVar62 >> 0x20);
  fStack_5e0 = (float)uVar63;
  fStack_5dc = (float)((ulong)uVar63 >> 0x20);
  fVar347 = local_5e8 + *pfVar1 * 0.33333334;
  fVar351 = fStack_5e4 + pfVar1[1] * 0.33333334;
  fVar352 = fStack_5e0 + pfVar1[2] * 0.33333334;
  fVar353 = fStack_5dc + pfVar1[3] * 0.33333334;
  pfVar1 = (float *)(*(long *)(p_Var10 + lVar77 + 0x38) +
                    *(long *)(p_Var10 + lVar77 + 0x48) * lVar75);
  auVar97._0_4_ = *pfVar1 * 0.33333334;
  auVar97._4_4_ = pfVar1[1] * 0.33333334;
  auVar97._8_4_ = pfVar1[2] * 0.33333334;
  auVar97._12_4_ = pfVar1[3] * 0.33333334;
  auVar95 = vsubps_avx(auVar94,auVar97);
  fVar364 = auVar94._0_4_;
  fVar370 = auVar94._4_4_;
  fVar372 = auVar94._8_4_;
  fVar375 = auVar94._12_4_;
  fVar334 = auVar95._0_4_ * 0.0;
  fVar340 = auVar95._4_4_ * 0.0;
  fVar341 = auVar95._8_4_ * 0.0;
  fVar342 = auVar95._12_4_ * 0.0;
  fVar365 = fVar364 * 0.0 + fVar334;
  fVar371 = fVar370 * 0.0 + fVar340;
  fVar373 = fVar372 * 0.0 + fVar341;
  fVar376 = fVar375 * 0.0 + fVar342;
  auVar128._0_4_ = fVar365 + fVar347 * 3.0;
  auVar128._4_4_ = fVar371 + fVar351 * 3.0;
  auVar128._8_4_ = fVar373 + fVar352 * 3.0;
  auVar128._12_4_ = fVar376 + fVar353 * 3.0;
  auVar171._0_4_ = local_5e8 * 3.0;
  auVar171._4_4_ = fStack_5e4 * 3.0;
  auVar171._8_4_ = fStack_5e0 * 3.0;
  auVar171._12_4_ = fStack_5dc * 3.0;
  auVar16 = vsubps_avx(auVar128,auVar171);
  lVar11 = *(long *)(lVar9 + 0x38 + lVar77);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar77);
  lVar13 = *(long *)(_Var12 + 0x38 + lVar77);
  lVar77 = *(long *)(_Var12 + 0x48 + lVar77);
  pfVar1 = (float *)(lVar11 + lVar9 * uVar73);
  fVar238 = *pfVar1;
  fVar258 = pfVar1[1];
  fVar255 = pfVar1[2];
  fVar271 = pfVar1[3];
  pfVar1 = (float *)(lVar13 + uVar73 * lVar77);
  fVar309 = fVar238 + *pfVar1 * 0.33333334;
  fVar318 = fVar258 + pfVar1[1] * 0.33333334;
  fVar319 = fVar255 + pfVar1[2] * 0.33333334;
  fVar320 = fVar271 + pfVar1[3] * 0.33333334;
  auVar94 = *(undefined1 (*) [16])(lVar11 + lVar9 * lVar75);
  pfVar1 = (float *)(lVar13 + lVar77 * lVar75);
  auVar172._0_4_ = *pfVar1 * 0.33333334;
  auVar172._4_4_ = pfVar1[1] * 0.33333334;
  auVar172._8_4_ = pfVar1[2] * 0.33333334;
  auVar172._12_4_ = pfVar1[3] * 0.33333334;
  auVar210 = vsubps_avx(auVar94,auVar172);
  fVar256 = auVar94._0_4_;
  fVar272 = auVar94._4_4_;
  fVar257 = auVar94._8_4_;
  fVar273 = auVar94._12_4_;
  fVar236 = auVar210._0_4_ * 0.0;
  fVar161 = auVar210._4_4_ * 0.0;
  fVar162 = auVar210._8_4_ * 0.0;
  fVar163 = auVar210._12_4_ * 0.0;
  fVar321 = fVar256 * 0.0 + fVar236;
  fVar331 = fVar272 * 0.0 + fVar161;
  fVar332 = fVar257 * 0.0 + fVar162;
  fVar333 = fVar273 * 0.0 + fVar163;
  auVar262._0_4_ = fVar309 * 3.0 + fVar321;
  auVar262._4_4_ = fVar318 * 3.0 + fVar331;
  auVar262._8_4_ = fVar319 * 3.0 + fVar332;
  auVar262._12_4_ = fVar320 * 3.0 + fVar333;
  auVar286._0_4_ = fVar238 * 3.0;
  auVar286._4_4_ = fVar258 * 3.0;
  auVar286._8_4_ = fVar255 * 3.0;
  auVar286._12_4_ = fVar271 * 3.0;
  auVar17 = vsubps_avx(auVar262,auVar286);
  auVar287._0_4_ = fVar364 * 3.0;
  auVar287._4_4_ = fVar370 * 3.0;
  auVar287._8_4_ = fVar372 * 3.0;
  auVar287._12_4_ = fVar375 * 3.0;
  auVar337._0_4_ = auVar95._0_4_ * 3.0;
  auVar337._4_4_ = auVar95._4_4_ * 3.0;
  auVar337._8_4_ = auVar95._8_4_ * 3.0;
  auVar337._12_4_ = auVar95._12_4_ * 3.0;
  auVar94 = vsubps_avx(auVar287,auVar337);
  fVar347 = fVar347 * 0.0;
  fVar351 = fVar351 * 0.0;
  fVar352 = fVar352 * 0.0;
  fVar353 = fVar353 * 0.0;
  auVar288._0_4_ = fVar347 + auVar94._0_4_;
  auVar288._4_4_ = fVar351 + auVar94._4_4_;
  auVar288._8_4_ = fVar352 + auVar94._8_4_;
  auVar288._12_4_ = fVar353 + auVar94._12_4_;
  auVar338._0_4_ = local_5e8 + fVar347 + fVar365;
  auVar338._4_4_ = fStack_5e4 + fVar351 + fVar371;
  auVar338._8_4_ = fStack_5e0 + fVar352 + fVar373;
  auVar338._12_4_ = fStack_5dc + fVar353 + fVar376;
  auVar297._0_4_ = local_5e8 * 0.0;
  auVar297._4_4_ = fStack_5e4 * 0.0;
  auVar297._8_4_ = fStack_5e0 * 0.0;
  auVar297._12_4_ = fStack_5dc * 0.0;
  local_5a8._0_4_ = auVar297._0_4_ + fVar347 + fVar364 + fVar334;
  local_5a8._4_4_ = auVar297._4_4_ + fVar351 + fVar370 + fVar340;
  fStack_5a0 = auVar297._8_4_ + fVar352 + fVar372 + fVar341;
  fStack_59c = auVar297._12_4_ + fVar353 + fVar375 + fVar342;
  auVar19 = vsubps_avx(auVar288,auVar297);
  auVar98._0_4_ = fVar256 * 3.0;
  auVar98._4_4_ = fVar272 * 3.0;
  auVar98._8_4_ = fVar257 * 3.0;
  auVar98._12_4_ = fVar273 * 3.0;
  auVar205._0_4_ = auVar210._0_4_ * 3.0;
  auVar205._4_4_ = auVar210._4_4_ * 3.0;
  auVar205._8_4_ = auVar210._8_4_ * 3.0;
  auVar205._12_4_ = auVar210._12_4_ * 3.0;
  auVar94 = vsubps_avx(auVar98,auVar205);
  fVar309 = fVar309 * 0.0;
  fVar318 = fVar318 * 0.0;
  fVar319 = fVar319 * 0.0;
  fVar320 = fVar320 * 0.0;
  auVar99._0_4_ = fVar309 + auVar94._0_4_;
  auVar99._4_4_ = fVar318 + auVar94._4_4_;
  auVar99._8_4_ = fVar319 + auVar94._8_4_;
  auVar99._12_4_ = fVar320 + auVar94._12_4_;
  auVar173._0_4_ = fVar238 + fVar309 + fVar321;
  auVar173._4_4_ = fVar258 + fVar318 + fVar331;
  auVar173._8_4_ = fVar255 + fVar319 + fVar332;
  auVar173._12_4_ = fVar271 + fVar320 + fVar333;
  auVar206._0_4_ = fVar238 * 0.0;
  auVar206._4_4_ = fVar258 * 0.0;
  auVar206._8_4_ = fVar255 * 0.0;
  auVar206._12_4_ = fVar271 * 0.0;
  auVar129._0_4_ = auVar206._0_4_ + fVar309 + fVar256 + fVar236;
  auVar129._4_4_ = auVar206._4_4_ + fVar318 + fVar272 + fVar161;
  auVar129._8_4_ = auVar206._8_4_ + fVar319 + fVar257 + fVar162;
  auVar129._12_4_ = auVar206._12_4_ + fVar320 + fVar273 + fVar163;
  auVar95 = vsubps_avx(auVar99,auVar206);
  auVar94 = vshufps_avx(auVar173,auVar173,0xc9);
  fVar332 = auVar16._0_4_;
  auVar207._0_4_ = fVar332 * auVar94._0_4_;
  fVar309 = auVar16._4_4_;
  auVar207._4_4_ = fVar309 * auVar94._4_4_;
  fVar318 = auVar16._8_4_;
  auVar207._8_4_ = fVar318 * auVar94._8_4_;
  fVar320 = auVar16._12_4_;
  auVar207._12_4_ = fVar320 * auVar94._12_4_;
  auVar94 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar174._0_4_ = auVar94._0_4_ * auVar173._0_4_;
  auVar174._4_4_ = auVar94._4_4_ * auVar173._4_4_;
  auVar174._8_4_ = auVar94._8_4_ * auVar173._8_4_;
  auVar174._12_4_ = auVar94._12_4_ * auVar173._12_4_;
  auVar210 = vsubps_avx(auVar174,auVar207);
  auVar208._0_4_ = auVar94._0_4_ * auVar17._0_4_;
  auVar208._4_4_ = auVar94._4_4_ * auVar17._4_4_;
  auVar208._8_4_ = auVar94._8_4_ * auVar17._8_4_;
  auVar208._12_4_ = auVar94._12_4_ * auVar17._12_4_;
  auVar94 = vshufps_avx(auVar17,auVar17,0xc9);
  auVar221._0_4_ = fVar332 * auVar94._0_4_;
  auVar221._4_4_ = fVar309 * auVar94._4_4_;
  auVar221._8_4_ = fVar318 * auVar94._8_4_;
  auVar221._12_4_ = fVar320 * auVar94._12_4_;
  auVar17 = vsubps_avx(auVar208,auVar221);
  auVar94 = vshufps_avx(auVar129,auVar129,0xc9);
  fVar236 = auVar19._0_4_;
  auVar222._0_4_ = fVar236 * auVar94._0_4_;
  fVar162 = auVar19._4_4_;
  auVar222._4_4_ = fVar162 * auVar94._4_4_;
  fVar321 = auVar19._8_4_;
  auVar222._8_4_ = fVar321 * auVar94._8_4_;
  fVar331 = auVar19._12_4_;
  auVar222._12_4_ = fVar331 * auVar94._12_4_;
  auVar94 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar130._0_4_ = auVar94._0_4_ * auVar129._0_4_;
  auVar130._4_4_ = auVar94._4_4_ * auVar129._4_4_;
  auVar130._8_4_ = auVar94._8_4_ * auVar129._8_4_;
  auVar130._12_4_ = auVar94._12_4_ * auVar129._12_4_;
  auVar18 = vsubps_avx(auVar130,auVar222);
  auVar210 = vshufps_avx(auVar210,auVar210,0xc9);
  auVar131._0_4_ = auVar94._0_4_ * auVar95._0_4_;
  auVar131._4_4_ = auVar94._4_4_ * auVar95._4_4_;
  auVar131._8_4_ = auVar94._8_4_ * auVar95._8_4_;
  auVar131._12_4_ = auVar94._12_4_ * auVar95._12_4_;
  auVar94 = vshufps_avx(auVar95,auVar95,0xc9);
  auVar100._0_4_ = fVar236 * auVar94._0_4_;
  auVar100._4_4_ = fVar162 * auVar94._4_4_;
  auVar100._8_4_ = fVar321 * auVar94._8_4_;
  auVar100._12_4_ = fVar331 * auVar94._12_4_;
  auVar94 = vdpps_avx(auVar210,auVar210,0x7f);
  auVar84 = vsubps_avx(auVar131,auVar100);
  fVar238 = auVar94._0_4_;
  auVar132 = ZEXT416((uint)fVar238);
  auVar95 = vrsqrtss_avx(auVar132,auVar132);
  fVar258 = auVar95._0_4_;
  auVar95 = vshufps_avx(auVar17,auVar17,0xc9);
  auVar94 = vshufps_avx(auVar94,auVar94,0);
  auVar244._0_4_ = auVar94._0_4_ * auVar95._0_4_;
  auVar244._4_4_ = auVar94._4_4_ * auVar95._4_4_;
  auVar244._8_4_ = auVar94._8_4_ * auVar95._8_4_;
  auVar244._12_4_ = auVar94._12_4_ * auVar95._12_4_;
  auVar94 = vdpps_avx(auVar210,auVar95,0x7f);
  auVar94 = vshufps_avx(auVar94,auVar94,0);
  auVar209._0_4_ = auVar210._0_4_ * auVar94._0_4_;
  auVar209._4_4_ = auVar210._4_4_ * auVar94._4_4_;
  auVar209._8_4_ = auVar210._8_4_ * auVar94._8_4_;
  auVar209._12_4_ = auVar210._12_4_ * auVar94._12_4_;
  auVar85 = vsubps_avx(auVar244,auVar209);
  auVar94 = vrcpss_avx(auVar132,auVar132);
  auVar94 = ZEXT416((uint)(auVar94._0_4_ * (2.0 - fVar238 * auVar94._0_4_)));
  auVar17 = vshufps_avx(auVar94,auVar94,0);
  auVar18 = vshufps_avx(auVar18,auVar18,0xc9);
  auVar94 = ZEXT416((uint)(fVar258 * 1.5 - fVar238 * 0.5 * fVar258 * fVar258 * fVar258));
  auVar132 = vshufps_avx(auVar94,auVar94,0);
  fVar256 = auVar210._0_4_ * auVar132._0_4_;
  fVar272 = auVar210._4_4_ * auVar132._4_4_;
  fVar257 = auVar210._8_4_ * auVar132._8_4_;
  fVar273 = auVar210._12_4_ * auVar132._12_4_;
  auVar94 = vdpps_avx(auVar18,auVar18,0x7f);
  fVar238 = auVar94._0_4_;
  auVar210 = ZEXT416((uint)fVar238);
  auVar95 = vrsqrtss_avx(auVar210,auVar210);
  fVar258 = auVar95._0_4_;
  auVar95 = vshufps_avx(auVar84,auVar84,0xc9);
  auVar94 = vshufps_avx(auVar94,auVar94,0);
  auVar263._0_4_ = auVar94._0_4_ * auVar95._0_4_;
  auVar263._4_4_ = auVar94._4_4_ * auVar95._4_4_;
  auVar263._8_4_ = auVar94._8_4_ * auVar95._8_4_;
  auVar263._12_4_ = auVar94._12_4_ * auVar95._12_4_;
  auVar94 = vdpps_avx(auVar18,auVar95,0x7f);
  auVar94 = vshufps_avx(auVar94,auVar94,0);
  auVar101._0_4_ = auVar94._0_4_ * auVar18._0_4_;
  auVar101._4_4_ = auVar94._4_4_ * auVar18._4_4_;
  auVar101._8_4_ = auVar94._8_4_ * auVar18._8_4_;
  auVar101._12_4_ = auVar94._12_4_ * auVar18._12_4_;
  auVar84 = vsubps_avx(auVar263,auVar101);
  auVar94 = vrcpss_avx(auVar210,auVar210);
  auVar94 = ZEXT416((uint)(auVar94._0_4_ * (2.0 - fVar238 * auVar94._0_4_)));
  auVar94 = vshufps_avx(auVar94,auVar94,0);
  auVar95 = ZEXT416((uint)(fVar258 * 1.5 - fVar258 * fVar258 * fVar238 * 0.5 * fVar258));
  auVar95 = vshufps_avx(auVar95,auVar95,0);
  fVar238 = auVar18._0_4_ * auVar95._0_4_;
  fVar258 = auVar18._4_4_ * auVar95._4_4_;
  fVar255 = auVar18._8_4_ * auVar95._8_4_;
  fVar271 = auVar18._12_4_ * auVar95._12_4_;
  auVar210 = vshufps_avx(auVar16,auVar16,0xff);
  auVar18 = vshufps_avx(auVar338,auVar338,0xff);
  auVar245._0_4_ = fVar256 * auVar18._0_4_;
  auVar245._4_4_ = fVar272 * auVar18._4_4_;
  auVar245._8_4_ = fVar257 * auVar18._8_4_;
  auVar245._12_4_ = fVar273 * auVar18._12_4_;
  auVar133._0_4_ =
       fVar256 * auVar210._0_4_ + auVar18._0_4_ * auVar132._0_4_ * auVar17._0_4_ * auVar85._0_4_;
  auVar133._4_4_ =
       fVar272 * auVar210._4_4_ + auVar18._4_4_ * auVar132._4_4_ * auVar17._4_4_ * auVar85._4_4_;
  auVar133._8_4_ =
       fVar257 * auVar210._8_4_ + auVar18._8_4_ * auVar132._8_4_ * auVar17._8_4_ * auVar85._8_4_;
  auVar133._12_4_ =
       fVar273 * auVar210._12_4_ +
       auVar18._12_4_ * auVar132._12_4_ * auVar17._12_4_ * auVar85._12_4_;
  auVar18 = vsubps_avx(auVar338,auVar245);
  auVar132 = vsubps_avx(auVar16,auVar133);
  auVar210 = vshufps_avx(auVar19,auVar19,0xff);
  auVar17 = vshufps_avx(_local_5a8,_local_5a8,0xff);
  auVar175._0_4_ = auVar17._0_4_ * fVar238;
  auVar175._4_4_ = auVar17._4_4_ * fVar258;
  auVar175._8_4_ = auVar17._8_4_ * fVar255;
  auVar175._12_4_ = auVar17._12_4_ * fVar271;
  auVar134._0_4_ =
       auVar210._0_4_ * fVar238 + auVar17._0_4_ * auVar95._0_4_ * auVar84._0_4_ * auVar94._0_4_;
  auVar134._4_4_ =
       auVar210._4_4_ * fVar258 + auVar17._4_4_ * auVar95._4_4_ * auVar84._4_4_ * auVar94._4_4_;
  auVar134._8_4_ =
       auVar210._8_4_ * fVar255 + auVar17._8_4_ * auVar95._8_4_ * auVar84._8_4_ * auVar94._8_4_;
  auVar134._12_4_ =
       auVar210._12_4_ * fVar271 + auVar17._12_4_ * auVar95._12_4_ * auVar84._12_4_ * auVar94._12_4_
  ;
  auVar210 = vsubps_avx(_local_5a8,auVar175);
  auVar348._0_4_ = (float)local_5a8._0_4_ + auVar175._0_4_;
  auVar348._4_4_ = (float)local_5a8._4_4_ + auVar175._4_4_;
  auVar348._8_4_ = fStack_5a0 + auVar175._8_4_;
  auVar348._12_4_ = fStack_59c + auVar175._12_4_;
  auVar17 = vsubps_avx(auVar19,auVar134);
  local_538 = auVar15._0_4_;
  fStack_534 = auVar15._4_4_;
  fStack_530 = auVar15._8_4_;
  fStack_52c = auVar15._12_4_;
  local_528 = auVar21._0_4_;
  fStack_524 = auVar21._4_4_;
  fStack_520 = auVar21._8_4_;
  fStack_51c = auVar21._12_4_;
  auVar94 = vshufps_avx(ZEXT416((uint)fVar217),ZEXT416((uint)fVar217),0);
  auVar95 = vshufps_avx(ZEXT416((uint)(1.0 - fVar217)),ZEXT416((uint)(1.0 - fVar217)),0);
  fVar238 = auVar94._0_4_;
  fVar258 = auVar94._4_4_;
  fVar255 = auVar94._8_4_;
  fVar271 = auVar94._12_4_;
  fVar256 = auVar95._0_4_;
  fVar272 = auVar95._4_4_;
  fVar257 = auVar95._8_4_;
  fVar273 = auVar95._12_4_;
  local_3e8._0_4_ = fVar256 * local_528 + fVar238 * auVar18._0_4_;
  local_3e8._4_4_ = fVar272 * fStack_524 + fVar258 * auVar18._4_4_;
  fStack_3e0 = fVar257 * fStack_520 + fVar255 * auVar18._8_4_;
  fStack_3dc = fVar273 * fStack_51c + fVar271 * auVar18._12_4_;
  fVar161 = fVar256 * (local_528 + local_538 * 0.33333334) +
            fVar238 * (auVar18._0_4_ + auVar132._0_4_ * 0.33333334);
  fVar163 = fVar272 * (fStack_524 + fStack_534 * 0.33333334) +
            fVar258 * (auVar18._4_4_ + auVar132._4_4_ * 0.33333334);
  fVar333 = fVar257 * (fStack_520 + fStack_530 * 0.33333334) +
            fVar255 * (auVar18._8_4_ + auVar132._8_4_ * 0.33333334);
  fVar319 = fVar273 * (fStack_51c + fStack_52c * 0.33333334) +
            fVar271 * (auVar18._12_4_ + auVar132._12_4_ * 0.33333334);
  local_4f8 = auVar20._0_4_;
  fStack_4f4 = auVar20._4_4_;
  fStack_4f0 = auVar20._8_4_;
  fStack_4ec = auVar20._12_4_;
  auVar211._0_4_ = local_4f8 * 0.33333334;
  auVar211._4_4_ = fStack_4f4 * 0.33333334;
  auVar211._8_4_ = fStack_4f0 * 0.33333334;
  auVar211._12_4_ = fStack_4ec * 0.33333334;
  auVar94 = vsubps_avx(auVar93,auVar211);
  auVar264._0_4_ = (fVar355 + auVar96._0_4_) * 0.33333334;
  auVar264._4_4_ = (fVar361 + auVar96._4_4_) * 0.33333334;
  auVar264._8_4_ = (fVar362 + auVar96._8_4_) * 0.33333334;
  auVar264._12_4_ = (fVar363 + auVar96._12_4_) * 0.33333334;
  auVar95 = vsubps_avx(_local_568,auVar264);
  auVar246._0_4_ = auVar17._0_4_ * 0.33333334;
  auVar246._4_4_ = auVar17._4_4_ * 0.33333334;
  auVar246._8_4_ = auVar17._8_4_ * 0.33333334;
  auVar246._12_4_ = auVar17._12_4_ * 0.33333334;
  auVar17 = vsubps_avx(auVar210,auVar246);
  auVar135._0_4_ = (fVar236 + auVar134._0_4_) * 0.33333334;
  auVar135._4_4_ = (fVar162 + auVar134._4_4_) * 0.33333334;
  auVar135._8_4_ = (fVar321 + auVar134._8_4_) * 0.33333334;
  auVar135._12_4_ = (fVar331 + auVar134._12_4_) * 0.33333334;
  auVar18 = vsubps_avx(auVar348,auVar135);
  local_3f8._0_4_ = fVar256 * auVar94._0_4_ + fVar238 * auVar17._0_4_;
  local_3f8._4_4_ = fVar272 * auVar94._4_4_ + fVar258 * auVar17._4_4_;
  fStack_3f0 = fVar257 * auVar94._8_4_ + fVar255 * auVar17._8_4_;
  fStack_3ec = fVar273 * auVar94._12_4_ + fVar271 * auVar17._12_4_;
  local_408._0_4_ = auVar210._0_4_ * fVar238 + fVar256 * auVar93._0_4_;
  local_408._4_4_ = auVar210._4_4_ * fVar258 + fVar272 * auVar93._4_4_;
  fStack_400 = auVar210._8_4_ * fVar255 + fVar257 * auVar93._8_4_;
  fStack_3fc = auVar210._12_4_ * fVar271 + fVar273 * auVar93._12_4_;
  local_418._0_4_ =
       fVar256 * (auVar324._0_4_ + auVar278._0_4_) + fVar238 * (auVar338._0_4_ + auVar245._0_4_);
  local_418._4_4_ =
       fVar272 * (auVar324._4_4_ + auVar278._4_4_) + fVar258 * (auVar338._4_4_ + auVar245._4_4_);
  fStack_410 = fVar257 * (auVar324._8_4_ + auVar278._8_4_) +
               fVar255 * (auVar338._8_4_ + auVar245._8_4_);
  fStack_40c = fVar273 * (auVar324._12_4_ + auVar278._12_4_) +
               fVar271 * (auVar338._12_4_ + auVar245._12_4_);
  fVar162 = fVar256 * (auVar324._0_4_ + auVar278._0_4_ + (fVar235 + auVar204._0_4_) * 0.33333334) +
            ((fVar332 + auVar133._0_4_) * 0.33333334 + auVar338._0_4_ + auVar245._0_4_) * fVar238;
  fVar321 = fVar272 * (auVar324._4_4_ + auVar278._4_4_ + (fVar237 + auVar204._4_4_) * 0.33333334) +
            ((fVar309 + auVar133._4_4_) * 0.33333334 + auVar338._4_4_ + auVar245._4_4_) * fVar258;
  fVar309 = fVar257 * (auVar324._8_4_ + auVar278._8_4_ + (fVar81 + auVar204._8_4_) * 0.33333334) +
            ((fVar318 + auVar133._8_4_) * 0.33333334 + auVar338._8_4_ + auVar245._8_4_) * fVar255;
  fVar320 = fVar273 * (auVar324._12_4_ + auVar278._12_4_ + (fVar82 + auVar204._12_4_) * 0.33333334)
            + ((fVar320 + auVar133._12_4_) * 0.33333334 + auVar338._12_4_ + auVar245._12_4_) *
              fVar271;
  fVar81 = fVar256 * auVar95._0_4_ + fVar238 * auVar18._0_4_;
  fVar331 = fVar272 * auVar95._4_4_ + fVar258 * auVar18._4_4_;
  fVar318 = fVar257 * auVar95._8_4_ + fVar255 * auVar18._8_4_;
  fVar334 = fVar273 * auVar95._12_4_ + fVar271 * auVar18._12_4_;
  local_428 = fVar256 * (auVar311._0_4_ + auVar243._0_4_) + auVar348._0_4_ * fVar238;
  fStack_424 = fVar272 * (auVar311._4_4_ + auVar243._4_4_) + auVar348._4_4_ * fVar258;
  fStack_420 = fVar257 * (auVar311._8_4_ + auVar243._8_4_) + auVar348._8_4_ * fVar255;
  fStack_41c = fVar273 * (auVar311._12_4_ + auVar243._12_4_) + auVar348._12_4_ * fVar271;
  auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar93 = vsubps_avx(_local_3e8,auVar94);
  auVar210 = vmovsldup_avx(auVar93);
  auVar95 = vmovshdup_avx(auVar93);
  auVar17 = vshufps_avx(auVar93,auVar93,0xaa);
  fVar238 = pre->ray_space[k].vx.field_0.m128[0];
  fVar258 = pre->ray_space[k].vx.field_0.m128[1];
  fVar255 = pre->ray_space[k].vx.field_0.m128[2];
  fVar271 = pre->ray_space[k].vx.field_0.m128[3];
  fVar256 = pre->ray_space[k].vy.field_0.m128[0];
  fVar272 = pre->ray_space[k].vy.field_0.m128[1];
  fVar257 = pre->ray_space[k].vy.field_0.m128[2];
  fVar273 = pre->ray_space[k].vy.field_0.m128[3];
  fVar217 = pre->ray_space[k].vz.field_0.m128[0];
  fVar235 = pre->ray_space[k].vz.field_0.m128[1];
  fVar236 = pre->ray_space[k].vz.field_0.m128[2];
  fVar237 = pre->ray_space[k].vz.field_0.m128[3];
  fVar82 = fVar238 * auVar210._0_4_ + fVar256 * auVar95._0_4_ + fVar217 * auVar17._0_4_;
  fVar332 = fVar258 * auVar210._4_4_ + fVar272 * auVar95._4_4_ + fVar235 * auVar17._4_4_;
  local_588._4_4_ = fVar332;
  local_588._0_4_ = fVar82;
  fStack_580 = fVar255 * auVar210._8_4_ + fVar257 * auVar95._8_4_ + fVar236 * auVar17._8_4_;
  fStack_57c = fVar271 * auVar210._12_4_ + fVar273 * auVar95._12_4_ + fVar237 * auVar17._12_4_;
  auVar68._4_4_ = fVar163;
  auVar68._0_4_ = fVar161;
  auVar68._8_4_ = fVar333;
  auVar68._12_4_ = fVar319;
  auVar20 = vsubps_avx(auVar68,auVar94);
  auVar17 = vshufps_avx(auVar20,auVar20,0xaa);
  auVar95 = vmovshdup_avx(auVar20);
  auVar210 = vmovsldup_avx(auVar20);
  auVar349._0_4_ = fVar238 * auVar210._0_4_ + fVar256 * auVar95._0_4_ + fVar217 * auVar17._0_4_;
  auVar349._4_4_ = fVar258 * auVar210._4_4_ + fVar272 * auVar95._4_4_ + fVar235 * auVar17._4_4_;
  auVar349._8_4_ = fVar255 * auVar210._8_4_ + fVar257 * auVar95._8_4_ + fVar236 * auVar17._8_4_;
  auVar349._12_4_ = fVar271 * auVar210._12_4_ + fVar273 * auVar95._12_4_ + fVar237 * auVar17._12_4_;
  auVar16 = vsubps_avx(_local_3f8,auVar94);
  auVar17 = vshufps_avx(auVar16,auVar16,0xaa);
  auVar95 = vmovshdup_avx(auVar16);
  auVar210 = vmovsldup_avx(auVar16);
  auVar356._0_4_ = fVar238 * auVar210._0_4_ + fVar256 * auVar95._0_4_ + fVar217 * auVar17._0_4_;
  auVar356._4_4_ = fVar258 * auVar210._4_4_ + fVar272 * auVar95._4_4_ + fVar235 * auVar17._4_4_;
  auVar356._8_4_ = fVar255 * auVar210._8_4_ + fVar257 * auVar95._8_4_ + fVar236 * auVar17._8_4_;
  auVar356._12_4_ = fVar271 * auVar210._12_4_ + fVar273 * auVar95._12_4_ + fVar237 * auVar17._12_4_;
  auVar19 = vsubps_avx(_local_408,auVar94);
  auVar17 = vshufps_avx(auVar19,auVar19,0xaa);
  auVar95 = vmovshdup_avx(auVar19);
  auVar210 = vmovsldup_avx(auVar19);
  auVar136._0_4_ = auVar210._0_4_ * fVar238 + auVar95._0_4_ * fVar256 + fVar217 * auVar17._0_4_;
  auVar136._4_4_ = auVar210._4_4_ * fVar258 + auVar95._4_4_ * fVar272 + fVar235 * auVar17._4_4_;
  auVar136._8_4_ = auVar210._8_4_ * fVar255 + auVar95._8_4_ * fVar257 + fVar236 * auVar17._8_4_;
  auVar136._12_4_ = auVar210._12_4_ * fVar271 + auVar95._12_4_ * fVar273 + fVar237 * auVar17._12_4_;
  auVar21 = vsubps_avx(_local_418,auVar94);
  auVar17 = vshufps_avx(auVar21,auVar21,0xaa);
  auVar95 = vmovshdup_avx(auVar21);
  auVar210 = vmovsldup_avx(auVar21);
  auVar289._0_4_ = auVar210._0_4_ * fVar238 + auVar95._0_4_ * fVar256 + auVar17._0_4_ * fVar217;
  auVar289._4_4_ = auVar210._4_4_ * fVar258 + auVar95._4_4_ * fVar272 + auVar17._4_4_ * fVar235;
  auVar289._8_4_ = auVar210._8_4_ * fVar255 + auVar95._8_4_ * fVar257 + auVar17._8_4_ * fVar236;
  auVar289._12_4_ = auVar210._12_4_ * fVar271 + auVar95._12_4_ * fVar273 + auVar17._12_4_ * fVar237;
  auVar66._4_4_ = fVar321;
  auVar66._0_4_ = fVar162;
  auVar66._8_4_ = fVar309;
  auVar66._12_4_ = fVar320;
  auVar84 = vsubps_avx(auVar66,auVar94);
  auVar17 = vshufps_avx(auVar84,auVar84,0xaa);
  auVar95 = vmovshdup_avx(auVar84);
  auVar210 = vmovsldup_avx(auVar84);
  auVar298._0_4_ = auVar210._0_4_ * fVar238 + auVar95._0_4_ * fVar256 + auVar17._0_4_ * fVar217;
  auVar298._4_4_ = auVar210._4_4_ * fVar258 + auVar95._4_4_ * fVar272 + auVar17._4_4_ * fVar235;
  auVar298._8_4_ = auVar210._8_4_ * fVar255 + auVar95._8_4_ * fVar257 + auVar17._8_4_ * fVar236;
  auVar298._12_4_ = auVar210._12_4_ * fVar271 + auVar95._12_4_ * fVar273 + auVar17._12_4_ * fVar237;
  auVar64._4_4_ = fVar331;
  auVar64._0_4_ = fVar81;
  auVar64._8_4_ = fVar318;
  auVar64._12_4_ = fVar334;
  auVar85 = vsubps_avx(auVar64,auVar94);
  auVar17 = vshufps_avx(auVar85,auVar85,0xaa);
  auVar95 = vmovshdup_avx(auVar85);
  auVar210 = vmovsldup_avx(auVar85);
  auVar312._0_4_ = auVar210._0_4_ * fVar238 + auVar95._0_4_ * fVar256 + auVar17._0_4_ * fVar217;
  auVar312._4_4_ = auVar210._4_4_ * fVar258 + auVar95._4_4_ * fVar272 + auVar17._4_4_ * fVar235;
  auVar312._8_4_ = auVar210._8_4_ * fVar255 + auVar95._8_4_ * fVar257 + auVar17._8_4_ * fVar236;
  auVar312._12_4_ = auVar210._12_4_ * fVar271 + auVar95._12_4_ * fVar273 + auVar17._12_4_ * fVar237;
  auVar70._4_4_ = fStack_424;
  auVar70._0_4_ = local_428;
  auVar70._8_4_ = fStack_420;
  auVar70._12_4_ = fStack_41c;
  auVar126 = vsubps_avx(auVar70,auVar94);
  auVar210 = vshufps_avx(auVar126,auVar126,0xaa);
  auVar94 = vmovshdup_avx(auVar126);
  auVar95 = vmovsldup_avx(auVar126);
  auVar102._0_4_ = fVar238 * auVar95._0_4_ + fVar256 * auVar94._0_4_ + fVar217 * auVar210._0_4_;
  auVar102._4_4_ = fVar258 * auVar95._4_4_ + fVar272 * auVar94._4_4_ + fVar235 * auVar210._4_4_;
  auVar102._8_4_ = fVar255 * auVar95._8_4_ + fVar257 * auVar94._8_4_ + fVar236 * auVar210._8_4_;
  auVar102._12_4_ = fVar271 * auVar95._12_4_ + fVar273 * auVar94._12_4_ + fVar237 * auVar210._12_4_;
  auVar17 = vmovlhps_avx(_local_588,auVar289);
  auVar18 = vmovlhps_avx(auVar349,auVar298);
  auVar132 = vmovlhps_avx(auVar356,auVar312);
  auVar15 = vmovlhps_avx(auVar136,auVar102);
  auVar94 = vminps_avx(auVar17,auVar18);
  auVar95 = vminps_avx(auVar132,auVar15);
  auVar210 = vminps_avx(auVar94,auVar95);
  auVar94 = vmaxps_avx(auVar17,auVar18);
  auVar95 = vmaxps_avx(auVar132,auVar15);
  auVar94 = vmaxps_avx(auVar94,auVar95);
  auVar95 = vshufpd_avx(auVar210,auVar210,3);
  auVar210 = vminps_avx(auVar210,auVar95);
  auVar95 = vshufpd_avx(auVar94,auVar94,3);
  auVar95 = vmaxps_avx(auVar94,auVar95);
  auVar265._8_4_ = 0x7fffffff;
  auVar265._0_8_ = 0x7fffffff7fffffff;
  auVar265._12_4_ = 0x7fffffff;
  auVar94 = vandps_avx(auVar210,auVar265);
  auVar95 = vandps_avx(auVar95,auVar265);
  auVar94 = vmaxps_avx(auVar94,auVar95);
  auVar95 = vmovshdup_avx(auVar94);
  auVar94 = vmaxss_avx(auVar95,auVar94);
  fVar258 = auVar94._0_4_ * 9.536743e-07;
  auVar94 = vshufps_avx(ZEXT416((uint)fVar258),ZEXT416((uint)fVar258),0);
  local_78._16_16_ = auVar94;
  local_78._0_16_ = auVar94;
  auVar103._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
  auVar103._8_4_ = auVar94._8_4_ ^ 0x80000000;
  auVar103._12_4_ = auVar94._12_4_ ^ 0x80000000;
  local_98._16_16_ = auVar103;
  local_98._0_16_ = auVar103;
  auVar94 = vpshufd_avx(ZEXT416(uVar72),0);
  auVar95 = vshufps_avx(ZEXT416(uVar71),ZEXT416(uVar71),0);
  bVar78 = false;
  uVar73 = 0;
  fVar238 = *(float *)(ray + k * 4 + 0x30);
  auVar210 = vsubps_avx(auVar18,auVar17);
  auVar165 = vsubps_avx(auVar132,auVar18);
  auVar83 = vsubps_avx(auVar15,auVar132);
  auVar125 = vsubps_avx(_local_418,_local_3e8);
  auVar67._4_4_ = fVar321;
  auVar67._0_4_ = fVar162;
  auVar67._8_4_ = fVar309;
  auVar67._12_4_ = fVar320;
  auVar69._4_4_ = fVar163;
  auVar69._0_4_ = fVar161;
  auVar69._8_4_ = fVar333;
  auVar69._12_4_ = fVar319;
  auVar164 = vsubps_avx(auVar67,auVar69);
  auVar65._4_4_ = fVar331;
  auVar65._0_4_ = fVar81;
  auVar65._8_4_ = fVar318;
  auVar65._12_4_ = fVar334;
  auVar166 = vsubps_avx(auVar65,_local_3f8);
  auVar198 = vsubps_avx(auVar70,_local_408);
  auVar330 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar369 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_0091a75f:
  do {
    auVar282 = auVar369._0_16_;
    auVar275 = auVar330._0_16_;
    auVar107 = vshufps_avx(auVar275,auVar275,0x50);
    auVar357._8_4_ = 0x3f800000;
    auVar357._0_8_ = 0x3f8000003f800000;
    auVar357._12_4_ = 0x3f800000;
    auVar360._16_4_ = 0x3f800000;
    auVar360._0_16_ = auVar357;
    auVar360._20_4_ = 0x3f800000;
    auVar360._24_4_ = 0x3f800000;
    auVar360._28_4_ = 0x3f800000;
    auVar199 = vsubps_avx(auVar357,auVar107);
    fVar255 = auVar107._0_4_;
    fVar271 = auVar107._4_4_;
    fVar256 = auVar107._8_4_;
    fVar272 = auVar107._12_4_;
    fVar257 = auVar199._0_4_;
    fVar273 = auVar199._4_4_;
    fVar217 = auVar199._8_4_;
    fVar235 = auVar199._12_4_;
    auVar212._0_4_ = auVar289._0_4_ * fVar255 + fVar257 * fVar82;
    auVar212._4_4_ = auVar289._4_4_ * fVar271 + fVar273 * fVar332;
    auVar212._8_4_ = auVar289._0_4_ * fVar256 + fVar217 * fVar82;
    auVar212._12_4_ = auVar289._4_4_ * fVar272 + fVar235 * fVar332;
    auVar176._0_4_ = auVar298._0_4_ * fVar255 + auVar349._0_4_ * fVar257;
    auVar176._4_4_ = auVar298._4_4_ * fVar271 + auVar349._4_4_ * fVar273;
    auVar176._8_4_ = auVar298._0_4_ * fVar256 + auVar349._0_4_ * fVar217;
    auVar176._12_4_ = auVar298._4_4_ * fVar272 + auVar349._4_4_ * fVar235;
    auVar279._0_4_ = auVar312._0_4_ * fVar255 + auVar356._0_4_ * fVar257;
    auVar279._4_4_ = auVar312._4_4_ * fVar271 + auVar356._4_4_ * fVar273;
    auVar279._8_4_ = auVar312._0_4_ * fVar256 + auVar356._0_4_ * fVar217;
    auVar279._12_4_ = auVar312._4_4_ * fVar272 + auVar356._4_4_ * fVar235;
    auVar223._0_4_ = auVar102._0_4_ * fVar255 + auVar136._0_4_ * fVar257;
    auVar223._4_4_ = auVar102._4_4_ * fVar271 + auVar136._4_4_ * fVar273;
    auVar223._8_4_ = auVar102._0_4_ * fVar256 + auVar136._0_4_ * fVar217;
    auVar223._12_4_ = auVar102._4_4_ * fVar272 + auVar136._4_4_ * fVar235;
    auVar107 = vmovshdup_avx(auVar282);
    auVar199 = vshufps_avx(auVar282,auVar282,0);
    auVar301._16_16_ = auVar199;
    auVar301._0_16_ = auVar199;
    auVar193 = vshufps_avx(auVar282,auVar282,0x55);
    auVar120._16_16_ = auVar193;
    auVar120._0_16_ = auVar193;
    auVar119 = vsubps_avx(auVar120,auVar301);
    auVar193 = vshufps_avx(auVar212,auVar212,0);
    auVar151 = vshufps_avx(auVar212,auVar212,0x55);
    auVar139 = vshufps_avx(auVar176,auVar176,0);
    auVar179 = vshufps_avx(auVar176,auVar176,0x55);
    auVar140 = vshufps_avx(auVar279,auVar279,0);
    auVar239 = vshufps_avx(auVar279,auVar279,0x55);
    auVar259 = vshufps_avx(auVar223,auVar223,0);
    auVar274 = vshufps_avx(auVar223,auVar223,0x55);
    auVar107 = ZEXT416((uint)((auVar107._0_4_ - auVar369._0_4_) * 0.04761905));
    auVar107 = vshufps_avx(auVar107,auVar107,0);
    auVar317._0_4_ = auVar199._0_4_ + auVar119._0_4_ * 0.0;
    auVar317._4_4_ = auVar199._4_4_ + auVar119._4_4_ * 0.14285715;
    auVar317._8_4_ = auVar199._8_4_ + auVar119._8_4_ * 0.2857143;
    auVar317._12_4_ = auVar199._12_4_ + auVar119._12_4_ * 0.42857146;
    auVar317._16_4_ = auVar199._0_4_ + auVar119._16_4_ * 0.5714286;
    auVar317._20_4_ = auVar199._4_4_ + auVar119._20_4_ * 0.71428573;
    auVar317._24_4_ = auVar199._8_4_ + auVar119._24_4_ * 0.8571429;
    auVar317._28_4_ = auVar199._12_4_ + auVar119._28_4_;
    auVar22 = vsubps_avx(auVar360,auVar317);
    fVar255 = auVar139._0_4_;
    fVar256 = auVar139._4_4_;
    fVar257 = auVar139._8_4_;
    fVar217 = auVar139._12_4_;
    fVar376 = auVar22._0_4_;
    fVar303 = auVar22._4_4_;
    fVar304 = auVar22._8_4_;
    fVar305 = auVar22._12_4_;
    fVar306 = auVar22._16_4_;
    fVar307 = auVar22._20_4_;
    fVar308 = auVar22._24_4_;
    fVar363 = auVar179._0_4_;
    fVar370 = auVar179._4_4_;
    fVar375 = auVar179._8_4_;
    fVar371 = auVar179._12_4_;
    fVar354 = auVar151._12_4_ + 1.0;
    fVar353 = auVar140._0_4_;
    fVar355 = auVar140._4_4_;
    fVar361 = auVar140._8_4_;
    fVar362 = auVar140._12_4_;
    fVar236 = fVar353 * auVar317._0_4_ + fVar376 * fVar255;
    fVar237 = fVar355 * auVar317._4_4_ + fVar303 * fVar256;
    fVar340 = fVar361 * auVar317._8_4_ + fVar304 * fVar257;
    fVar341 = fVar362 * auVar317._12_4_ + fVar305 * fVar217;
    fVar342 = fVar353 * auVar317._16_4_ + fVar306 * fVar255;
    fVar347 = fVar355 * auVar317._20_4_ + fVar307 * fVar256;
    fVar351 = fVar361 * auVar317._24_4_ + fVar308 * fVar257;
    fVar271 = auVar239._0_4_;
    fVar272 = auVar239._4_4_;
    fVar273 = auVar239._8_4_;
    fVar235 = auVar239._12_4_;
    fVar364 = fVar363 * fVar376 + auVar317._0_4_ * fVar271;
    fVar372 = fVar370 * fVar303 + auVar317._4_4_ * fVar272;
    fVar365 = fVar375 * fVar304 + auVar317._8_4_ * fVar273;
    fVar373 = fVar371 * fVar305 + auVar317._12_4_ * fVar235;
    fVar343 = fVar363 * fVar306 + auVar317._16_4_ * fVar271;
    fVar344 = fVar370 * fVar307 + auVar317._20_4_ * fVar272;
    fVar345 = fVar375 * fVar308 + auVar317._24_4_ * fVar273;
    fVar346 = fVar371 + fVar217;
    auVar199 = vshufps_avx(auVar212,auVar212,0xaa);
    auVar139 = vshufps_avx(auVar212,auVar212,0xff);
    fVar352 = fVar362 + 0.0;
    auVar179 = vshufps_avx(auVar176,auVar176,0xaa);
    auVar140 = vshufps_avx(auVar176,auVar176,0xff);
    auVar233._0_4_ =
         fVar376 * (auVar317._0_4_ * fVar255 + fVar376 * auVar193._0_4_) + auVar317._0_4_ * fVar236;
    auVar233._4_4_ =
         fVar303 * (auVar317._4_4_ * fVar256 + fVar303 * auVar193._4_4_) + auVar317._4_4_ * fVar237;
    auVar233._8_4_ =
         fVar304 * (auVar317._8_4_ * fVar257 + fVar304 * auVar193._8_4_) + auVar317._8_4_ * fVar340;
    auVar233._12_4_ =
         fVar305 * (auVar317._12_4_ * fVar217 + fVar305 * auVar193._12_4_) +
         auVar317._12_4_ * fVar341;
    auVar233._16_4_ =
         fVar306 * (auVar317._16_4_ * fVar255 + fVar306 * auVar193._0_4_) +
         auVar317._16_4_ * fVar342;
    auVar233._20_4_ =
         fVar307 * (auVar317._20_4_ * fVar256 + fVar307 * auVar193._4_4_) +
         auVar317._20_4_ * fVar347;
    auVar233._24_4_ =
         fVar308 * (auVar317._24_4_ * fVar257 + fVar308 * auVar193._8_4_) +
         auVar317._24_4_ * fVar351;
    auVar233._28_4_ = auVar193._12_4_ + 1.0 + fVar235;
    auVar253._0_4_ =
         fVar376 * (fVar363 * auVar317._0_4_ + auVar151._0_4_ * fVar376) + auVar317._0_4_ * fVar364;
    auVar253._4_4_ =
         fVar303 * (fVar370 * auVar317._4_4_ + auVar151._4_4_ * fVar303) + auVar317._4_4_ * fVar372;
    auVar253._8_4_ =
         fVar304 * (fVar375 * auVar317._8_4_ + auVar151._8_4_ * fVar304) + auVar317._8_4_ * fVar365;
    auVar253._12_4_ =
         fVar305 * (fVar371 * auVar317._12_4_ + auVar151._12_4_ * fVar305) +
         auVar317._12_4_ * fVar373;
    auVar253._16_4_ =
         fVar306 * (fVar363 * auVar317._16_4_ + auVar151._0_4_ * fVar306) +
         auVar317._16_4_ * fVar343;
    auVar253._20_4_ =
         fVar307 * (fVar370 * auVar317._20_4_ + auVar151._4_4_ * fVar307) +
         auVar317._20_4_ * fVar344;
    auVar253._24_4_ =
         fVar308 * (fVar375 * auVar317._24_4_ + auVar151._8_4_ * fVar308) +
         auVar317._24_4_ * fVar345;
    auVar253._28_4_ = auVar274._12_4_ + fVar235;
    auVar121._0_4_ =
         fVar376 * fVar236 + auVar317._0_4_ * (fVar353 * fVar376 + auVar259._0_4_ * auVar317._0_4_);
    auVar121._4_4_ =
         fVar303 * fVar237 + auVar317._4_4_ * (fVar355 * fVar303 + auVar259._4_4_ * auVar317._4_4_);
    auVar121._8_4_ =
         fVar304 * fVar340 + auVar317._8_4_ * (fVar361 * fVar304 + auVar259._8_4_ * auVar317._8_4_);
    auVar121._12_4_ =
         fVar305 * fVar341 +
         auVar317._12_4_ * (fVar362 * fVar305 + auVar259._12_4_ * auVar317._12_4_);
    auVar121._16_4_ =
         fVar306 * fVar342 +
         auVar317._16_4_ * (fVar353 * fVar306 + auVar259._0_4_ * auVar317._16_4_);
    auVar121._20_4_ =
         fVar307 * fVar347 +
         auVar317._20_4_ * (fVar355 * fVar307 + auVar259._4_4_ * auVar317._20_4_);
    auVar121._24_4_ =
         fVar308 * fVar351 +
         auVar317._24_4_ * (fVar361 * fVar308 + auVar259._8_4_ * auVar317._24_4_);
    auVar121._28_4_ = fVar217 + 1.0 + fVar352;
    auVar329._0_4_ =
         fVar376 * fVar364 + auVar317._0_4_ * (auVar274._0_4_ * auVar317._0_4_ + fVar376 * fVar271);
    auVar329._4_4_ =
         fVar303 * fVar372 + auVar317._4_4_ * (auVar274._4_4_ * auVar317._4_4_ + fVar303 * fVar272);
    auVar329._8_4_ =
         fVar304 * fVar365 + auVar317._8_4_ * (auVar274._8_4_ * auVar317._8_4_ + fVar304 * fVar273);
    auVar329._12_4_ =
         fVar305 * fVar373 +
         auVar317._12_4_ * (auVar274._12_4_ * auVar317._12_4_ + fVar305 * fVar235);
    auVar329._16_4_ =
         fVar306 * fVar343 +
         auVar317._16_4_ * (auVar274._0_4_ * auVar317._16_4_ + fVar306 * fVar271);
    auVar329._20_4_ =
         fVar307 * fVar344 +
         auVar317._20_4_ * (auVar274._4_4_ * auVar317._20_4_ + fVar307 * fVar272);
    auVar329._24_4_ =
         fVar308 * fVar345 +
         auVar317._24_4_ * (auVar274._8_4_ * auVar317._24_4_ + fVar308 * fVar273);
    auVar329._28_4_ = fVar352 + fVar235 + 0.0;
    local_b8._0_4_ = fVar376 * auVar233._0_4_ + auVar317._0_4_ * auVar121._0_4_;
    local_b8._4_4_ = fVar303 * auVar233._4_4_ + auVar317._4_4_ * auVar121._4_4_;
    local_b8._8_4_ = fVar304 * auVar233._8_4_ + auVar317._8_4_ * auVar121._8_4_;
    local_b8._12_4_ = fVar305 * auVar233._12_4_ + auVar317._12_4_ * auVar121._12_4_;
    local_b8._16_4_ = fVar306 * auVar233._16_4_ + auVar317._16_4_ * auVar121._16_4_;
    local_b8._20_4_ = fVar307 * auVar233._20_4_ + auVar317._20_4_ * auVar121._20_4_;
    local_b8._24_4_ = fVar308 * auVar233._24_4_ + auVar317._24_4_ * auVar121._24_4_;
    local_b8._28_4_ = fVar346 + fVar235 + 0.0;
    auVar216._0_4_ = fVar376 * auVar253._0_4_ + auVar317._0_4_ * auVar329._0_4_;
    auVar216._4_4_ = fVar303 * auVar253._4_4_ + auVar317._4_4_ * auVar329._4_4_;
    auVar216._8_4_ = fVar304 * auVar253._8_4_ + auVar317._8_4_ * auVar329._8_4_;
    auVar216._12_4_ = fVar305 * auVar253._12_4_ + auVar317._12_4_ * auVar329._12_4_;
    auVar216._16_4_ = fVar306 * auVar253._16_4_ + auVar317._16_4_ * auVar329._16_4_;
    auVar216._20_4_ = fVar307 * auVar253._20_4_ + auVar317._20_4_ * auVar329._20_4_;
    auVar216._24_4_ = fVar308 * auVar253._24_4_ + auVar317._24_4_ * auVar329._24_4_;
    auVar216._28_4_ = fVar346 + fVar352;
    auVar23 = vsubps_avx(auVar121,auVar233);
    auVar119 = vsubps_avx(auVar329,auVar253);
    local_4f8 = auVar107._0_4_;
    fStack_4f4 = auVar107._4_4_;
    fStack_4f0 = auVar107._8_4_;
    fStack_4ec = auVar107._12_4_;
    local_f8 = local_4f8 * auVar23._0_4_ * 3.0;
    fStack_f4 = fStack_4f4 * auVar23._4_4_ * 3.0;
    auVar24._4_4_ = fStack_f4;
    auVar24._0_4_ = local_f8;
    fStack_f0 = fStack_4f0 * auVar23._8_4_ * 3.0;
    auVar24._8_4_ = fStack_f0;
    fStack_ec = fStack_4ec * auVar23._12_4_ * 3.0;
    auVar24._12_4_ = fStack_ec;
    fStack_e8 = local_4f8 * auVar23._16_4_ * 3.0;
    auVar24._16_4_ = fStack_e8;
    fStack_e4 = fStack_4f4 * auVar23._20_4_ * 3.0;
    auVar24._20_4_ = fStack_e4;
    fStack_e0 = fStack_4f0 * auVar23._24_4_ * 3.0;
    auVar24._24_4_ = fStack_e0;
    auVar24._28_4_ = auVar23._28_4_;
    local_118 = local_4f8 * auVar119._0_4_ * 3.0;
    fStack_114 = fStack_4f4 * auVar119._4_4_ * 3.0;
    auVar25._4_4_ = fStack_114;
    auVar25._0_4_ = local_118;
    fStack_110 = fStack_4f0 * auVar119._8_4_ * 3.0;
    auVar25._8_4_ = fStack_110;
    fStack_10c = fStack_4ec * auVar119._12_4_ * 3.0;
    auVar25._12_4_ = fStack_10c;
    fStack_108 = local_4f8 * auVar119._16_4_ * 3.0;
    auVar25._16_4_ = fStack_108;
    fStack_104 = fStack_4f4 * auVar119._20_4_ * 3.0;
    auVar25._20_4_ = fStack_104;
    fStack_100 = fStack_4f0 * auVar119._24_4_ * 3.0;
    auVar25._24_4_ = fStack_100;
    auVar25._28_4_ = fVar346;
    auVar24 = vsubps_avx(local_b8,auVar24);
    auVar119 = vperm2f128_avx(auVar24,auVar24,1);
    auVar119 = vshufps_avx(auVar119,auVar24,0x30);
    auVar119 = vshufps_avx(auVar24,auVar119,0x29);
    auVar25 = vsubps_avx(auVar216,auVar25);
    auVar24 = vperm2f128_avx(auVar25,auVar25,1);
    auVar24 = vshufps_avx(auVar24,auVar25,0x30);
    auVar25 = vshufps_avx(auVar25,auVar24,0x29);
    fVar344 = auVar179._0_4_;
    fVar345 = auVar179._4_4_;
    fVar374 = auVar179._8_4_;
    fVar217 = auVar199._12_4_;
    fVar355 = auVar140._0_4_;
    fVar362 = auVar140._4_4_;
    fVar364 = auVar140._8_4_;
    fVar372 = auVar140._12_4_;
    auVar107 = vshufps_avx(auVar279,auVar279,0xaa);
    fVar255 = auVar107._0_4_;
    fVar256 = auVar107._4_4_;
    fVar257 = auVar107._8_4_;
    fVar235 = auVar107._12_4_;
    fVar340 = auVar317._0_4_ * fVar255 + fVar344 * fVar376;
    fVar341 = auVar317._4_4_ * fVar256 + fVar345 * fVar303;
    fVar342 = auVar317._8_4_ * fVar257 + fVar374 * fVar304;
    fVar347 = auVar317._12_4_ * fVar235 + auVar179._12_4_ * fVar305;
    fVar351 = auVar317._16_4_ * fVar255 + fVar344 * fVar306;
    fVar352 = auVar317._20_4_ * fVar256 + fVar345 * fVar307;
    fVar353 = auVar317._24_4_ * fVar257 + fVar374 * fVar308;
    auVar107 = vshufps_avx(auVar279,auVar279,0xff);
    fVar271 = auVar107._0_4_;
    fVar272 = auVar107._4_4_;
    fVar273 = auVar107._8_4_;
    fVar236 = auVar107._12_4_;
    fVar361 = auVar317._0_4_ * fVar271 + fVar355 * fVar376;
    fVar363 = auVar317._4_4_ * fVar272 + fVar362 * fVar303;
    fVar370 = auVar317._8_4_ * fVar273 + fVar364 * fVar304;
    fVar375 = auVar317._12_4_ * fVar236 + fVar372 * fVar305;
    fVar365 = auVar317._16_4_ * fVar271 + fVar355 * fVar306;
    fVar371 = auVar317._20_4_ * fVar272 + fVar362 * fVar307;
    fVar373 = auVar317._24_4_ * fVar273 + fVar364 * fVar308;
    auVar107 = vshufps_avx(auVar223,auVar223,0xaa);
    fVar343 = auVar107._12_4_ + fVar235;
    auVar193 = vshufps_avx(auVar223,auVar223,0xff);
    fVar237 = auVar193._12_4_;
    auVar122._0_4_ =
         fVar376 * (fVar344 * auVar317._0_4_ + fVar376 * auVar199._0_4_) + auVar317._0_4_ * fVar340;
    auVar122._4_4_ =
         fVar303 * (fVar345 * auVar317._4_4_ + fVar303 * auVar199._4_4_) + auVar317._4_4_ * fVar341;
    auVar122._8_4_ =
         fVar304 * (fVar374 * auVar317._8_4_ + fVar304 * auVar199._8_4_) + auVar317._8_4_ * fVar342;
    auVar122._12_4_ =
         fVar305 * (auVar179._12_4_ * auVar317._12_4_ + fVar305 * fVar217) +
         auVar317._12_4_ * fVar347;
    auVar122._16_4_ =
         fVar306 * (fVar344 * auVar317._16_4_ + fVar306 * auVar199._0_4_) +
         auVar317._16_4_ * fVar351;
    auVar122._20_4_ =
         fVar307 * (fVar345 * auVar317._20_4_ + fVar307 * auVar199._4_4_) +
         auVar317._20_4_ * fVar352;
    auVar122._24_4_ =
         fVar308 * (fVar374 * auVar317._24_4_ + fVar308 * auVar199._8_4_) +
         auVar317._24_4_ * fVar353;
    auVar122._28_4_ = auVar25._28_4_ + fVar217 + fVar237;
    auVar157._0_4_ =
         fVar376 * (fVar355 * auVar317._0_4_ + auVar139._0_4_ * fVar376) + auVar317._0_4_ * fVar361;
    auVar157._4_4_ =
         fVar303 * (fVar362 * auVar317._4_4_ + auVar139._4_4_ * fVar303) + auVar317._4_4_ * fVar363;
    auVar157._8_4_ =
         fVar304 * (fVar364 * auVar317._8_4_ + auVar139._8_4_ * fVar304) + auVar317._8_4_ * fVar370;
    auVar157._12_4_ =
         fVar305 * (fVar372 * auVar317._12_4_ + auVar139._12_4_ * fVar305) +
         auVar317._12_4_ * fVar375;
    auVar157._16_4_ =
         fVar306 * (fVar355 * auVar317._16_4_ + auVar139._0_4_ * fVar306) +
         auVar317._16_4_ * fVar365;
    auVar157._20_4_ =
         fVar307 * (fVar362 * auVar317._20_4_ + auVar139._4_4_ * fVar307) +
         auVar317._20_4_ * fVar371;
    auVar157._24_4_ =
         fVar308 * (fVar364 * auVar317._24_4_ + auVar139._8_4_ * fVar308) +
         auVar317._24_4_ * fVar373;
    auVar157._28_4_ = fVar217 + auVar24._28_4_ + fVar237;
    auVar24 = vperm2f128_avx(local_b8,local_b8,1);
    auVar24 = vshufps_avx(auVar24,local_b8,0x30);
    auVar120 = vshufps_avx(local_b8,auVar24,0x29);
    auVar254._0_4_ =
         auVar317._0_4_ * (auVar107._0_4_ * auVar317._0_4_ + fVar376 * fVar255) + fVar376 * fVar340;
    auVar254._4_4_ =
         auVar317._4_4_ * (auVar107._4_4_ * auVar317._4_4_ + fVar303 * fVar256) + fVar303 * fVar341;
    auVar254._8_4_ =
         auVar317._8_4_ * (auVar107._8_4_ * auVar317._8_4_ + fVar304 * fVar257) + fVar304 * fVar342;
    auVar254._12_4_ =
         auVar317._12_4_ * (auVar107._12_4_ * auVar317._12_4_ + fVar305 * fVar235) +
         fVar305 * fVar347;
    auVar254._16_4_ =
         auVar317._16_4_ * (auVar107._0_4_ * auVar317._16_4_ + fVar306 * fVar255) +
         fVar306 * fVar351;
    auVar254._20_4_ =
         auVar317._20_4_ * (auVar107._4_4_ * auVar317._20_4_ + fVar307 * fVar256) +
         fVar307 * fVar352;
    auVar254._24_4_ =
         auVar317._24_4_ * (auVar107._8_4_ * auVar317._24_4_ + fVar308 * fVar257) +
         fVar308 * fVar353;
    auVar254._28_4_ = fVar343 + fVar354 + auVar253._28_4_;
    auVar295._0_4_ =
         fVar376 * fVar361 + auVar317._0_4_ * (auVar317._0_4_ * auVar193._0_4_ + fVar376 * fVar271);
    auVar295._4_4_ =
         fVar303 * fVar363 + auVar317._4_4_ * (auVar317._4_4_ * auVar193._4_4_ + fVar303 * fVar272);
    auVar295._8_4_ =
         fVar304 * fVar370 + auVar317._8_4_ * (auVar317._8_4_ * auVar193._8_4_ + fVar304 * fVar273);
    auVar295._12_4_ =
         fVar305 * fVar375 + auVar317._12_4_ * (auVar317._12_4_ * fVar237 + fVar305 * fVar236);
    auVar295._16_4_ =
         fVar306 * fVar365 +
         auVar317._16_4_ * (auVar317._16_4_ * auVar193._0_4_ + fVar306 * fVar271);
    auVar295._20_4_ =
         fVar307 * fVar371 +
         auVar317._20_4_ * (auVar317._20_4_ * auVar193._4_4_ + fVar307 * fVar272);
    auVar295._24_4_ =
         fVar308 * fVar373 +
         auVar317._24_4_ * (auVar317._24_4_ * auVar193._8_4_ + fVar308 * fVar273);
    auVar295._28_4_ = fVar354 + fVar372 + fVar237 + fVar236;
    auVar281._0_4_ = fVar376 * auVar122._0_4_ + auVar317._0_4_ * auVar254._0_4_;
    auVar281._4_4_ = fVar303 * auVar122._4_4_ + auVar317._4_4_ * auVar254._4_4_;
    auVar281._8_4_ = fVar304 * auVar122._8_4_ + auVar317._8_4_ * auVar254._8_4_;
    auVar281._12_4_ = fVar305 * auVar122._12_4_ + auVar317._12_4_ * auVar254._12_4_;
    auVar281._16_4_ = fVar306 * auVar122._16_4_ + auVar317._16_4_ * auVar254._16_4_;
    auVar281._20_4_ = fVar307 * auVar122._20_4_ + auVar317._20_4_ * auVar254._20_4_;
    auVar281._24_4_ = fVar308 * auVar122._24_4_ + auVar317._24_4_ * auVar254._24_4_;
    auVar281._28_4_ = fVar343 + fVar237 + fVar236;
    auVar302._0_4_ = fVar376 * auVar157._0_4_ + auVar317._0_4_ * auVar295._0_4_;
    auVar302._4_4_ = fVar303 * auVar157._4_4_ + auVar317._4_4_ * auVar295._4_4_;
    auVar302._8_4_ = fVar304 * auVar157._8_4_ + auVar317._8_4_ * auVar295._8_4_;
    auVar302._12_4_ = fVar305 * auVar157._12_4_ + auVar317._12_4_ * auVar295._12_4_;
    auVar302._16_4_ = fVar306 * auVar157._16_4_ + auVar317._16_4_ * auVar295._16_4_;
    auVar302._20_4_ = fVar307 * auVar157._20_4_ + auVar317._20_4_ * auVar295._20_4_;
    auVar302._24_4_ = fVar308 * auVar157._24_4_ + auVar317._24_4_ * auVar295._24_4_;
    auVar302._28_4_ = auVar22._28_4_ + auVar317._28_4_;
    auVar26 = vsubps_avx(auVar254,auVar122);
    auVar24 = vsubps_avx(auVar295,auVar157);
    local_138 = local_4f8 * auVar26._0_4_ * 3.0;
    fStack_134 = fStack_4f4 * auVar26._4_4_ * 3.0;
    auVar22._4_4_ = fStack_134;
    auVar22._0_4_ = local_138;
    fStack_130 = fStack_4f0 * auVar26._8_4_ * 3.0;
    auVar22._8_4_ = fStack_130;
    fStack_12c = fStack_4ec * auVar26._12_4_ * 3.0;
    auVar22._12_4_ = fStack_12c;
    fStack_128 = local_4f8 * auVar26._16_4_ * 3.0;
    auVar22._16_4_ = fStack_128;
    fStack_124 = fStack_4f4 * auVar26._20_4_ * 3.0;
    auVar22._20_4_ = fStack_124;
    fStack_120 = fStack_4f0 * auVar26._24_4_ * 3.0;
    auVar22._24_4_ = fStack_120;
    auVar22._28_4_ = auVar26._28_4_;
    local_158 = local_4f8 * auVar24._0_4_ * 3.0;
    fStack_154 = fStack_4f4 * auVar24._4_4_ * 3.0;
    auVar27._4_4_ = fStack_154;
    auVar27._0_4_ = local_158;
    fStack_150 = fStack_4f0 * auVar24._8_4_ * 3.0;
    auVar27._8_4_ = fStack_150;
    fStack_14c = fStack_4ec * auVar24._12_4_ * 3.0;
    auVar27._12_4_ = fStack_14c;
    fStack_148 = local_4f8 * auVar24._16_4_ * 3.0;
    auVar27._16_4_ = fStack_148;
    fStack_144 = fStack_4f4 * auVar24._20_4_ * 3.0;
    auVar27._20_4_ = fStack_144;
    fStack_140 = fStack_4f0 * auVar24._24_4_ * 3.0;
    auVar27._24_4_ = fStack_140;
    auVar27._28_4_ = auVar254._28_4_;
    auVar24 = vperm2f128_avx(auVar281,auVar281,1);
    auVar24 = vshufps_avx(auVar24,auVar281,0x30);
    auVar121 = vshufps_avx(auVar281,auVar24,0x29);
    auVar22 = vsubps_avx(auVar281,auVar22);
    auVar24 = vperm2f128_avx(auVar22,auVar22,1);
    auVar24 = vshufps_avx(auVar24,auVar22,0x30);
    auVar24 = vshufps_avx(auVar22,auVar24,0x29);
    auVar27 = vsubps_avx(auVar302,auVar27);
    auVar22 = vperm2f128_avx(auVar27,auVar27,1);
    auVar22 = vshufps_avx(auVar22,auVar27,0x30);
    auVar27 = vshufps_avx(auVar27,auVar22,0x29);
    auVar28 = vsubps_avx(auVar281,local_b8);
    auVar157 = vsubps_avx(auVar121,auVar120);
    fVar255 = auVar157._0_4_ + auVar28._0_4_;
    fVar271 = auVar157._4_4_ + auVar28._4_4_;
    fVar256 = auVar157._8_4_ + auVar28._8_4_;
    fVar272 = auVar157._12_4_ + auVar28._12_4_;
    fVar257 = auVar157._16_4_ + auVar28._16_4_;
    fVar273 = auVar157._20_4_ + auVar28._20_4_;
    fVar217 = auVar157._24_4_ + auVar28._24_4_;
    auVar22 = vperm2f128_avx(auVar216,auVar216,1);
    auVar22 = vshufps_avx(auVar22,auVar216,0x30);
    local_d8 = vshufps_avx(auVar216,auVar22,0x29);
    auVar22 = vperm2f128_avx(auVar302,auVar302,1);
    auVar22 = vshufps_avx(auVar22,auVar302,0x30);
    auVar122 = vshufps_avx(auVar302,auVar22,0x29);
    auVar22 = vsubps_avx(auVar302,auVar216);
    auVar233 = vsubps_avx(auVar122,local_d8);
    fVar235 = auVar233._0_4_ + auVar22._0_4_;
    fVar236 = auVar233._4_4_ + auVar22._4_4_;
    fVar237 = auVar233._8_4_ + auVar22._8_4_;
    fVar340 = auVar233._12_4_ + auVar22._12_4_;
    fVar341 = auVar233._16_4_ + auVar22._16_4_;
    fVar342 = auVar233._20_4_ + auVar22._20_4_;
    fVar347 = auVar233._24_4_ + auVar22._24_4_;
    auVar29._4_4_ = fVar271 * auVar216._4_4_;
    auVar29._0_4_ = fVar255 * auVar216._0_4_;
    auVar29._8_4_ = fVar256 * auVar216._8_4_;
    auVar29._12_4_ = fVar272 * auVar216._12_4_;
    auVar29._16_4_ = fVar257 * auVar216._16_4_;
    auVar29._20_4_ = fVar273 * auVar216._20_4_;
    auVar29._24_4_ = fVar217 * auVar216._24_4_;
    auVar29._28_4_ = auVar22._28_4_;
    auVar30._4_4_ = fVar236 * local_b8._4_4_;
    auVar30._0_4_ = fVar235 * local_b8._0_4_;
    auVar30._8_4_ = fVar237 * local_b8._8_4_;
    auVar30._12_4_ = fVar340 * local_b8._12_4_;
    auVar30._16_4_ = fVar341 * local_b8._16_4_;
    auVar30._20_4_ = fVar342 * local_b8._20_4_;
    auVar30._24_4_ = fVar347 * local_b8._24_4_;
    auVar30._28_4_ = fVar343;
    auVar29 = vsubps_avx(auVar29,auVar30);
    local_f8 = local_b8._0_4_ + local_f8;
    fStack_f4 = local_b8._4_4_ + fStack_f4;
    fStack_f0 = local_b8._8_4_ + fStack_f0;
    fStack_ec = local_b8._12_4_ + fStack_ec;
    fStack_e8 = local_b8._16_4_ + fStack_e8;
    fStack_e4 = local_b8._20_4_ + fStack_e4;
    fStack_e0 = local_b8._24_4_ + fStack_e0;
    fStack_dc = local_b8._28_4_ + auVar23._28_4_;
    local_118 = local_118 + auVar216._0_4_;
    fStack_114 = fStack_114 + auVar216._4_4_;
    fStack_110 = fStack_110 + auVar216._8_4_;
    fStack_10c = fStack_10c + auVar216._12_4_;
    fStack_108 = fStack_108 + auVar216._16_4_;
    fStack_104 = fStack_104 + auVar216._20_4_;
    fStack_100 = fStack_100 + auVar216._24_4_;
    fStack_fc = fVar346 + auVar216._28_4_;
    auVar23._4_4_ = fVar271 * fStack_114;
    auVar23._0_4_ = fVar255 * local_118;
    auVar23._8_4_ = fVar256 * fStack_110;
    auVar23._12_4_ = fVar272 * fStack_10c;
    auVar23._16_4_ = fVar257 * fStack_108;
    auVar23._20_4_ = fVar273 * fStack_104;
    auVar23._24_4_ = fVar217 * fStack_100;
    auVar23._28_4_ = fVar346;
    auVar31._4_4_ = fVar236 * fStack_f4;
    auVar31._0_4_ = fVar235 * local_f8;
    auVar31._8_4_ = fVar237 * fStack_f0;
    auVar31._12_4_ = fVar340 * fStack_ec;
    auVar31._16_4_ = fVar341 * fStack_e8;
    auVar31._20_4_ = fVar342 * fStack_e4;
    auVar31._24_4_ = fVar347 * fStack_e0;
    auVar31._28_4_ = fVar346 + auVar216._28_4_;
    auVar23 = vsubps_avx(auVar23,auVar31);
    local_5a8._0_4_ = auVar25._0_4_;
    local_5a8._4_4_ = auVar25._4_4_;
    fStack_5a0 = auVar25._8_4_;
    fStack_59c = auVar25._12_4_;
    fStack_598 = auVar25._16_4_;
    fStack_594 = auVar25._20_4_;
    fStack_590 = auVar25._24_4_;
    auVar32._4_4_ = fVar271 * (float)local_5a8._4_4_;
    auVar32._0_4_ = fVar255 * (float)local_5a8._0_4_;
    auVar32._8_4_ = fVar256 * fStack_5a0;
    auVar32._12_4_ = fVar272 * fStack_59c;
    auVar32._16_4_ = fVar257 * fStack_598;
    auVar32._20_4_ = fVar273 * fStack_594;
    auVar32._24_4_ = fVar217 * fStack_590;
    auVar32._28_4_ = fVar346;
    local_588._0_4_ = auVar119._0_4_;
    local_588._4_4_ = auVar119._4_4_;
    fStack_580 = auVar119._8_4_;
    fStack_57c = auVar119._12_4_;
    fStack_578 = auVar119._16_4_;
    fStack_574 = auVar119._20_4_;
    fStack_570 = auVar119._24_4_;
    auVar33._4_4_ = fVar236 * (float)local_588._4_4_;
    auVar33._0_4_ = fVar235 * (float)local_588._0_4_;
    auVar33._8_4_ = fVar237 * fStack_580;
    auVar33._12_4_ = fVar340 * fStack_57c;
    auVar33._16_4_ = fVar341 * fStack_578;
    auVar33._20_4_ = fVar342 * fStack_574;
    auVar33._24_4_ = fVar347 * fStack_570;
    auVar33._28_4_ = local_b8._28_4_;
    auVar30 = vsubps_avx(auVar32,auVar33);
    auVar34._4_4_ = local_d8._4_4_ * fVar271;
    auVar34._0_4_ = local_d8._0_4_ * fVar255;
    auVar34._8_4_ = local_d8._8_4_ * fVar256;
    auVar34._12_4_ = local_d8._12_4_ * fVar272;
    auVar34._16_4_ = local_d8._16_4_ * fVar257;
    auVar34._20_4_ = local_d8._20_4_ * fVar273;
    auVar34._24_4_ = local_d8._24_4_ * fVar217;
    auVar34._28_4_ = fVar346;
    auVar35._4_4_ = auVar120._4_4_ * fVar236;
    auVar35._0_4_ = auVar120._0_4_ * fVar235;
    auVar35._8_4_ = auVar120._8_4_ * fVar237;
    auVar35._12_4_ = auVar120._12_4_ * fVar340;
    auVar35._16_4_ = auVar120._16_4_ * fVar341;
    auVar35._20_4_ = auVar120._20_4_ * fVar342;
    auVar35._24_4_ = auVar120._24_4_ * fVar347;
    auVar35._28_4_ = local_d8._28_4_;
    local_4f8 = auVar24._0_4_;
    fStack_4f4 = auVar24._4_4_;
    fStack_4f0 = auVar24._8_4_;
    fStack_4ec = auVar24._12_4_;
    fStack_4e8 = auVar24._16_4_;
    fStack_4e4 = auVar24._20_4_;
    fStack_4e0 = auVar24._24_4_;
    auVar31 = vsubps_avx(auVar34,auVar35);
    auVar36._4_4_ = auVar302._4_4_ * fVar271;
    auVar36._0_4_ = auVar302._0_4_ * fVar255;
    auVar36._8_4_ = auVar302._8_4_ * fVar256;
    auVar36._12_4_ = auVar302._12_4_ * fVar272;
    auVar36._16_4_ = auVar302._16_4_ * fVar257;
    auVar36._20_4_ = auVar302._20_4_ * fVar273;
    auVar36._24_4_ = auVar302._24_4_ * fVar217;
    auVar36._28_4_ = fVar346;
    auVar37._4_4_ = fVar236 * auVar281._4_4_;
    auVar37._0_4_ = fVar235 * auVar281._0_4_;
    auVar37._8_4_ = fVar237 * auVar281._8_4_;
    auVar37._12_4_ = fVar340 * auVar281._12_4_;
    auVar37._16_4_ = fVar341 * auVar281._16_4_;
    auVar37._20_4_ = fVar342 * auVar281._20_4_;
    auVar37._24_4_ = fVar347 * auVar281._24_4_;
    auVar37._28_4_ = fStack_dc;
    auVar32 = vsubps_avx(auVar36,auVar37);
    local_138 = auVar281._0_4_ + local_138;
    fStack_134 = auVar281._4_4_ + fStack_134;
    fStack_130 = auVar281._8_4_ + fStack_130;
    fStack_12c = auVar281._12_4_ + fStack_12c;
    fStack_128 = auVar281._16_4_ + fStack_128;
    fStack_124 = auVar281._20_4_ + fStack_124;
    fStack_120 = auVar281._24_4_ + fStack_120;
    fStack_11c = auVar281._28_4_ + auVar26._28_4_;
    local_158 = auVar302._0_4_ + local_158;
    fStack_154 = auVar302._4_4_ + fStack_154;
    fStack_150 = auVar302._8_4_ + fStack_150;
    fStack_14c = auVar302._12_4_ + fStack_14c;
    fStack_148 = auVar302._16_4_ + fStack_148;
    fStack_144 = auVar302._20_4_ + fStack_144;
    fStack_140 = auVar302._24_4_ + fStack_140;
    fStack_13c = auVar302._28_4_ + auVar254._28_4_;
    auVar26._4_4_ = fVar271 * fStack_154;
    auVar26._0_4_ = fVar255 * local_158;
    auVar26._8_4_ = fVar256 * fStack_150;
    auVar26._12_4_ = fVar272 * fStack_14c;
    auVar26._16_4_ = fVar257 * fStack_148;
    auVar26._20_4_ = fVar273 * fStack_144;
    auVar26._24_4_ = fVar217 * fStack_140;
    auVar26._28_4_ = auVar302._28_4_ + auVar254._28_4_;
    auVar38._4_4_ = fStack_134 * fVar236;
    auVar38._0_4_ = local_138 * fVar235;
    auVar38._8_4_ = fStack_130 * fVar237;
    auVar38._12_4_ = fStack_12c * fVar340;
    auVar38._16_4_ = fStack_128 * fVar341;
    auVar38._20_4_ = fStack_124 * fVar342;
    auVar38._24_4_ = fStack_120 * fVar347;
    auVar38._28_4_ = fStack_11c;
    auVar26 = vsubps_avx(auVar26,auVar38);
    auVar39._4_4_ = fVar271 * auVar27._4_4_;
    auVar39._0_4_ = fVar255 * auVar27._0_4_;
    auVar39._8_4_ = fVar256 * auVar27._8_4_;
    auVar39._12_4_ = fVar272 * auVar27._12_4_;
    auVar39._16_4_ = fVar257 * auVar27._16_4_;
    auVar39._20_4_ = fVar273 * auVar27._20_4_;
    auVar39._24_4_ = fVar217 * auVar27._24_4_;
    auVar39._28_4_ = fStack_11c;
    auVar40._4_4_ = fVar236 * fStack_4f4;
    auVar40._0_4_ = fVar235 * local_4f8;
    auVar40._8_4_ = fVar237 * fStack_4f0;
    auVar40._12_4_ = fVar340 * fStack_4ec;
    auVar40._16_4_ = fVar341 * fStack_4e8;
    auVar40._20_4_ = fVar342 * fStack_4e4;
    auVar40._24_4_ = fVar347 * fStack_4e0;
    auVar40._28_4_ = auVar27._28_4_;
    auVar33 = vsubps_avx(auVar39,auVar40);
    auVar41._4_4_ = fVar271 * auVar122._4_4_;
    auVar41._0_4_ = fVar255 * auVar122._0_4_;
    auVar41._8_4_ = fVar256 * auVar122._8_4_;
    auVar41._12_4_ = fVar272 * auVar122._12_4_;
    auVar41._16_4_ = fVar257 * auVar122._16_4_;
    auVar41._20_4_ = fVar273 * auVar122._20_4_;
    auVar41._24_4_ = fVar217 * auVar122._24_4_;
    auVar41._28_4_ = auVar157._28_4_ + auVar28._28_4_;
    auVar28._4_4_ = auVar121._4_4_ * fVar236;
    auVar28._0_4_ = auVar121._0_4_ * fVar235;
    auVar28._8_4_ = auVar121._8_4_ * fVar237;
    auVar28._12_4_ = auVar121._12_4_ * fVar340;
    auVar28._16_4_ = auVar121._16_4_ * fVar341;
    auVar28._20_4_ = auVar121._20_4_ * fVar342;
    auVar28._24_4_ = auVar121._24_4_ * fVar347;
    auVar28._28_4_ = auVar233._28_4_ + auVar22._28_4_;
    auVar28 = vsubps_avx(auVar41,auVar28);
    auVar24 = vminps_avx(auVar29,auVar23);
    auVar119 = vmaxps_avx(auVar29,auVar23);
    auVar25 = vminps_avx(auVar30,auVar31);
    auVar25 = vminps_avx(auVar24,auVar25);
    auVar24 = vmaxps_avx(auVar30,auVar31);
    auVar119 = vmaxps_avx(auVar119,auVar24);
    auVar22 = vminps_avx(auVar32,auVar26);
    auVar24 = vmaxps_avx(auVar32,auVar26);
    auVar23 = vminps_avx(auVar33,auVar28);
    auVar23 = vminps_avx(auVar22,auVar23);
    auVar23 = vminps_avx(auVar25,auVar23);
    auVar25 = vmaxps_avx(auVar33,auVar28);
    auVar24 = vmaxps_avx(auVar24,auVar25);
    auVar24 = vmaxps_avx(auVar119,auVar24);
    auVar119 = vcmpps_avx(auVar23,local_78,2);
    auVar24 = vcmpps_avx(auVar24,local_98,5);
    auVar119 = vandps_avx(auVar24,auVar119);
    auVar24 = local_178 & auVar119;
    if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0x7f,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar24 >> 0xbf,0) != '\0') ||
        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar24[0x1f] < '\0')
    {
      auVar24 = vsubps_avx(auVar120,local_b8);
      auVar25 = vsubps_avx(auVar121,auVar281);
      fVar271 = auVar24._0_4_ + auVar25._0_4_;
      fVar256 = auVar24._4_4_ + auVar25._4_4_;
      fVar272 = auVar24._8_4_ + auVar25._8_4_;
      fVar257 = auVar24._12_4_ + auVar25._12_4_;
      fVar273 = auVar24._16_4_ + auVar25._16_4_;
      fVar217 = auVar24._20_4_ + auVar25._20_4_;
      fVar235 = auVar24._24_4_ + auVar25._24_4_;
      auVar23 = vsubps_avx(local_d8,auVar216);
      auVar26 = vsubps_avx(auVar122,auVar302);
      fVar236 = auVar23._0_4_ + auVar26._0_4_;
      fVar237 = auVar23._4_4_ + auVar26._4_4_;
      fVar340 = auVar23._8_4_ + auVar26._8_4_;
      fVar341 = auVar23._12_4_ + auVar26._12_4_;
      fVar342 = auVar23._16_4_ + auVar26._16_4_;
      fVar347 = auVar23._20_4_ + auVar26._20_4_;
      fVar351 = auVar23._24_4_ + auVar26._24_4_;
      fVar255 = auVar26._28_4_;
      auVar42._4_4_ = auVar216._4_4_ * fVar256;
      auVar42._0_4_ = auVar216._0_4_ * fVar271;
      auVar42._8_4_ = auVar216._8_4_ * fVar272;
      auVar42._12_4_ = auVar216._12_4_ * fVar257;
      auVar42._16_4_ = auVar216._16_4_ * fVar273;
      auVar42._20_4_ = auVar216._20_4_ * fVar217;
      auVar42._24_4_ = auVar216._24_4_ * fVar235;
      auVar42._28_4_ = auVar216._28_4_;
      auVar43._4_4_ = local_b8._4_4_ * fVar237;
      auVar43._0_4_ = local_b8._0_4_ * fVar236;
      auVar43._8_4_ = local_b8._8_4_ * fVar340;
      auVar43._12_4_ = local_b8._12_4_ * fVar341;
      auVar43._16_4_ = local_b8._16_4_ * fVar342;
      auVar43._20_4_ = local_b8._20_4_ * fVar347;
      auVar43._24_4_ = local_b8._24_4_ * fVar351;
      auVar43._28_4_ = local_b8._28_4_;
      auVar26 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = fVar256 * fStack_114;
      auVar44._0_4_ = fVar271 * local_118;
      auVar44._8_4_ = fVar272 * fStack_110;
      auVar44._12_4_ = fVar257 * fStack_10c;
      auVar44._16_4_ = fVar273 * fStack_108;
      auVar44._20_4_ = fVar217 * fStack_104;
      auVar44._24_4_ = fVar235 * fStack_100;
      auVar44._28_4_ = auVar216._28_4_;
      auVar45._4_4_ = fVar237 * fStack_f4;
      auVar45._0_4_ = fVar236 * local_f8;
      auVar45._8_4_ = fVar340 * fStack_f0;
      auVar45._12_4_ = fVar341 * fStack_ec;
      auVar45._16_4_ = fVar342 * fStack_e8;
      auVar45._20_4_ = fVar347 * fStack_e4;
      auVar45._24_4_ = fVar351 * fStack_e0;
      auVar45._28_4_ = fVar255;
      auVar28 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar256 * (float)local_5a8._4_4_;
      auVar46._0_4_ = fVar271 * (float)local_5a8._0_4_;
      auVar46._8_4_ = fVar272 * fStack_5a0;
      auVar46._12_4_ = fVar257 * fStack_59c;
      auVar46._16_4_ = fVar273 * fStack_598;
      auVar46._20_4_ = fVar217 * fStack_594;
      auVar46._24_4_ = fVar235 * fStack_590;
      auVar46._28_4_ = fVar255;
      auVar47._4_4_ = fVar237 * (float)local_588._4_4_;
      auVar47._0_4_ = fVar236 * (float)local_588._0_4_;
      auVar47._8_4_ = fVar340 * fStack_580;
      auVar47._12_4_ = fVar341 * fStack_57c;
      auVar47._16_4_ = fVar342 * fStack_578;
      auVar47._20_4_ = fVar347 * fStack_574;
      auVar47._24_4_ = fVar351 * fStack_570;
      auVar47._28_4_ = auVar22._28_4_;
      auVar157 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = local_d8._4_4_ * fVar256;
      auVar48._0_4_ = local_d8._0_4_ * fVar271;
      auVar48._8_4_ = local_d8._8_4_ * fVar272;
      auVar48._12_4_ = local_d8._12_4_ * fVar257;
      auVar48._16_4_ = local_d8._16_4_ * fVar273;
      auVar48._20_4_ = local_d8._20_4_ * fVar217;
      auVar48._24_4_ = local_d8._24_4_ * fVar235;
      auVar48._28_4_ = auVar22._28_4_;
      auVar49._4_4_ = auVar120._4_4_ * fVar237;
      auVar49._0_4_ = auVar120._0_4_ * fVar236;
      auVar49._8_4_ = auVar120._8_4_ * fVar340;
      auVar49._12_4_ = auVar120._12_4_ * fVar341;
      auVar49._16_4_ = auVar120._16_4_ * fVar342;
      auVar49._20_4_ = auVar120._20_4_ * fVar347;
      uVar4 = auVar120._28_4_;
      auVar49._24_4_ = auVar120._24_4_ * fVar351;
      auVar49._28_4_ = uVar4;
      auVar120 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = auVar302._4_4_ * fVar256;
      auVar50._0_4_ = auVar302._0_4_ * fVar271;
      auVar50._8_4_ = auVar302._8_4_ * fVar272;
      auVar50._12_4_ = auVar302._12_4_ * fVar257;
      auVar50._16_4_ = auVar302._16_4_ * fVar273;
      auVar50._20_4_ = auVar302._20_4_ * fVar217;
      auVar50._24_4_ = auVar302._24_4_ * fVar235;
      auVar50._28_4_ = uVar4;
      auVar51._4_4_ = auVar281._4_4_ * fVar237;
      auVar51._0_4_ = auVar281._0_4_ * fVar236;
      auVar51._8_4_ = auVar281._8_4_ * fVar340;
      auVar51._12_4_ = auVar281._12_4_ * fVar341;
      auVar51._16_4_ = auVar281._16_4_ * fVar342;
      auVar51._20_4_ = auVar281._20_4_ * fVar347;
      auVar51._24_4_ = auVar281._24_4_ * fVar351;
      auVar51._28_4_ = auVar281._28_4_;
      auVar233 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = fVar256 * fStack_154;
      auVar52._0_4_ = fVar271 * local_158;
      auVar52._8_4_ = fVar272 * fStack_150;
      auVar52._12_4_ = fVar257 * fStack_14c;
      auVar52._16_4_ = fVar273 * fStack_148;
      auVar52._20_4_ = fVar217 * fStack_144;
      auVar52._24_4_ = fVar235 * fStack_140;
      auVar52._28_4_ = uVar4;
      auVar53._4_4_ = fVar237 * fStack_134;
      auVar53._0_4_ = fVar236 * local_138;
      auVar53._8_4_ = fVar340 * fStack_130;
      auVar53._12_4_ = fVar341 * fStack_12c;
      auVar53._16_4_ = fVar342 * fStack_128;
      auVar53._20_4_ = fVar347 * fStack_124;
      auVar53._24_4_ = fVar351 * fStack_120;
      auVar53._28_4_ = auVar302._28_4_;
      auVar29 = vsubps_avx(auVar52,auVar53);
      auVar54._4_4_ = fVar256 * auVar27._4_4_;
      auVar54._0_4_ = fVar271 * auVar27._0_4_;
      auVar54._8_4_ = fVar272 * auVar27._8_4_;
      auVar54._12_4_ = fVar257 * auVar27._12_4_;
      auVar54._16_4_ = fVar273 * auVar27._16_4_;
      auVar54._20_4_ = fVar217 * auVar27._20_4_;
      auVar54._24_4_ = fVar235 * auVar27._24_4_;
      auVar54._28_4_ = auVar302._28_4_;
      auVar55._4_4_ = fStack_4f4 * fVar237;
      auVar55._0_4_ = local_4f8 * fVar236;
      auVar55._8_4_ = fStack_4f0 * fVar340;
      auVar55._12_4_ = fStack_4ec * fVar341;
      auVar55._16_4_ = fStack_4e8 * fVar342;
      auVar55._20_4_ = fStack_4e4 * fVar347;
      auVar55._24_4_ = fStack_4e0 * fVar351;
      auVar55._28_4_ = local_d8._28_4_;
      auVar27 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = fVar256 * auVar122._4_4_;
      auVar56._0_4_ = fVar271 * auVar122._0_4_;
      auVar56._8_4_ = fVar272 * auVar122._8_4_;
      auVar56._12_4_ = fVar257 * auVar122._12_4_;
      auVar56._16_4_ = fVar273 * auVar122._16_4_;
      auVar56._20_4_ = fVar217 * auVar122._20_4_;
      auVar56._24_4_ = fVar235 * auVar122._24_4_;
      auVar56._28_4_ = auVar24._28_4_ + auVar25._28_4_;
      auVar57._4_4_ = auVar121._4_4_ * fVar237;
      auVar57._0_4_ = auVar121._0_4_ * fVar236;
      auVar57._8_4_ = auVar121._8_4_ * fVar340;
      auVar57._12_4_ = auVar121._12_4_ * fVar341;
      auVar57._16_4_ = auVar121._16_4_ * fVar342;
      auVar57._20_4_ = auVar121._20_4_ * fVar347;
      auVar57._24_4_ = auVar121._24_4_ * fVar351;
      auVar57._28_4_ = auVar23._28_4_ + fVar255;
      auVar121 = vsubps_avx(auVar56,auVar57);
      auVar25 = vminps_avx(auVar26,auVar28);
      auVar24 = vmaxps_avx(auVar26,auVar28);
      auVar22 = vminps_avx(auVar157,auVar120);
      auVar22 = vminps_avx(auVar25,auVar22);
      auVar25 = vmaxps_avx(auVar157,auVar120);
      auVar24 = vmaxps_avx(auVar24,auVar25);
      auVar23 = vminps_avx(auVar233,auVar29);
      auVar25 = vmaxps_avx(auVar233,auVar29);
      auVar120 = vminps_avx(auVar27,auVar121);
      auVar23 = vminps_avx(auVar23,auVar120);
      auVar23 = vminps_avx(auVar22,auVar23);
      auVar22 = vmaxps_avx(auVar27,auVar121);
      auVar25 = vmaxps_avx(auVar25,auVar22);
      auVar25 = vmaxps_avx(auVar24,auVar25);
      auVar24 = vcmpps_avx(auVar23,local_78,2);
      auVar25 = vcmpps_avx(auVar25,local_98,5);
      auVar24 = vandps_avx(auVar25,auVar24);
      auVar119 = vandps_avx(local_178,auVar119);
      auVar25 = auVar119 & auVar24;
      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar25 >> 0x7f,0) != '\0') ||
            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0xbf,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar25[0x1f] < '\0') {
        auVar119 = vandps_avx(auVar24,auVar119);
        uVar71 = vmovmskps_avx(auVar119);
        if (uVar71 != 0) {
          mask_stack[uVar73] = uVar71 & 0xff;
          BVar5 = (BBox1f)vmovlps_avx(auVar282);
          cu_stack[uVar73] = BVar5;
          BVar5 = (BBox1f)vmovlps_avx(auVar275);
          cv_stack[uVar73] = BVar5;
          uVar73 = (ulong)((int)uVar73 + 1);
        }
      }
    }
LAB_0091adc5:
    do {
      do {
        do {
          do {
            if ((int)uVar73 == 0) {
              auVar59 = ZEXT812(0) << 0x20;
              if (bVar78) goto LAB_0091bdc3;
              uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar118._4_4_ = uVar4;
              auVar118._0_4_ = uVar4;
              auVar118._8_4_ = uVar4;
              auVar118._12_4_ = uVar4;
              auVar94 = vcmpps_avx(auVar260,auVar118,2);
              uVar72 = vmovmskps_avx(auVar94);
              uVar79 = uVar79 & uVar79 + 0xf & uVar72;
              goto LAB_00919ac2;
            }
            uVar74 = (int)uVar73 - 1;
            uVar71 = mask_stack[uVar74];
            fVar255 = cu_stack[uVar74].lower;
            fVar271 = cu_stack[uVar74].upper;
            auVar325._8_8_ = 0;
            auVar325._0_4_ = cv_stack[uVar74].lower;
            auVar325._4_4_ = cv_stack[uVar74].upper;
            auVar330 = ZEXT1664(auVar325);
            uVar14 = 0;
            if (uVar71 != 0) {
              for (; (uVar71 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
              }
            }
            uVar71 = uVar71 - 1 & uVar71;
            mask_stack[uVar74] = uVar71;
            if (uVar71 == 0) {
              uVar73 = (ulong)uVar74;
            }
            fVar272 = (float)(uVar14 + 1) * 0.14285715;
            fVar256 = (1.0 - (float)uVar14 * 0.14285715) * fVar255 +
                      fVar271 * (float)uVar14 * 0.14285715;
            fVar255 = (1.0 - fVar272) * fVar255 + fVar271 * fVar272;
            fVar271 = fVar255 - fVar256;
            if (0.16666667 <= fVar271) {
              auVar107 = vinsertps_avx(ZEXT416((uint)fVar256),ZEXT416((uint)fVar255),0x10);
              auVar369 = ZEXT1664(auVar107);
              goto LAB_0091a75f;
            }
            auVar107 = vshufps_avx(auVar325,auVar325,0x50);
            auVar137._8_4_ = 0x3f800000;
            auVar137._0_8_ = 0x3f8000003f800000;
            auVar137._12_4_ = 0x3f800000;
            auVar199 = vsubps_avx(auVar137,auVar107);
            fVar272 = auVar107._0_4_;
            fVar257 = auVar107._4_4_;
            fVar273 = auVar107._8_4_;
            fVar217 = auVar107._12_4_;
            fVar235 = auVar199._0_4_;
            fVar236 = auVar199._4_4_;
            fVar237 = auVar199._8_4_;
            fVar340 = auVar199._12_4_;
            auVar177._0_4_ = fVar272 * auVar289._0_4_ + fVar235 * fVar82;
            auVar177._4_4_ = fVar257 * auVar289._4_4_ + fVar236 * fVar332;
            auVar177._8_4_ = fVar273 * auVar289._0_4_ + fVar237 * fVar82;
            auVar177._12_4_ = fVar217 * auVar289._4_4_ + fVar340 * fVar332;
            auVar224._0_4_ = auVar298._0_4_ * fVar272 + auVar349._0_4_ * fVar235;
            auVar224._4_4_ = auVar298._4_4_ * fVar257 + auVar349._4_4_ * fVar236;
            auVar224._8_4_ = auVar298._0_4_ * fVar273 + auVar349._0_4_ * fVar237;
            auVar224._12_4_ = auVar298._4_4_ * fVar217 + auVar349._4_4_ * fVar340;
            auVar247._0_4_ = auVar312._0_4_ * fVar272 + auVar356._0_4_ * fVar235;
            auVar247._4_4_ = auVar312._4_4_ * fVar257 + auVar356._4_4_ * fVar236;
            auVar247._8_4_ = auVar312._0_4_ * fVar273 + auVar356._0_4_ * fVar237;
            auVar247._12_4_ = auVar312._4_4_ * fVar217 + auVar356._4_4_ * fVar340;
            auVar104._0_4_ = auVar102._0_4_ * fVar272 + auVar136._0_4_ * fVar235;
            auVar104._4_4_ = auVar102._4_4_ * fVar257 + auVar136._4_4_ * fVar236;
            auVar104._8_4_ = auVar102._0_4_ * fVar273 + auVar136._0_4_ * fVar237;
            auVar104._12_4_ = auVar102._4_4_ * fVar217 + auVar136._4_4_ * fVar340;
            auVar158._16_16_ = auVar177;
            auVar158._0_16_ = auVar177;
            auVar196._16_16_ = auVar224;
            auVar196._0_16_ = auVar224;
            auVar234._16_16_ = auVar247;
            auVar234._0_16_ = auVar247;
            auVar119 = ZEXT2032(CONCAT416(fVar255,ZEXT416((uint)fVar256)));
            auVar119 = vshufps_avx(auVar119,auVar119,0);
            auVar24 = vsubps_avx(auVar196,auVar158);
            fVar272 = auVar119._0_4_;
            fVar257 = auVar119._4_4_;
            fVar273 = auVar119._8_4_;
            fVar217 = auVar119._12_4_;
            fVar235 = auVar119._16_4_;
            fVar236 = auVar119._20_4_;
            fVar237 = auVar119._24_4_;
            auVar159._0_4_ = auVar177._0_4_ + auVar24._0_4_ * fVar272;
            auVar159._4_4_ = auVar177._4_4_ + auVar24._4_4_ * fVar257;
            auVar159._8_4_ = auVar177._8_4_ + auVar24._8_4_ * fVar273;
            auVar159._12_4_ = auVar177._12_4_ + auVar24._12_4_ * fVar217;
            auVar159._16_4_ = auVar177._0_4_ + auVar24._16_4_ * fVar235;
            auVar159._20_4_ = auVar177._4_4_ + auVar24._20_4_ * fVar236;
            auVar159._24_4_ = auVar177._8_4_ + auVar24._24_4_ * fVar237;
            auVar159._28_4_ = auVar177._12_4_ + auVar24._28_4_;
            auVar119 = vsubps_avx(auVar234,auVar196);
            auVar197._0_4_ = auVar224._0_4_ + auVar119._0_4_ * fVar272;
            auVar197._4_4_ = auVar224._4_4_ + auVar119._4_4_ * fVar257;
            auVar197._8_4_ = auVar224._8_4_ + auVar119._8_4_ * fVar273;
            auVar197._12_4_ = auVar224._12_4_ + auVar119._12_4_ * fVar217;
            auVar197._16_4_ = auVar224._0_4_ + auVar119._16_4_ * fVar235;
            auVar197._20_4_ = auVar224._4_4_ + auVar119._20_4_ * fVar236;
            auVar197._24_4_ = auVar224._8_4_ + auVar119._24_4_ * fVar237;
            auVar197._28_4_ = auVar224._12_4_ + auVar119._28_4_;
            auVar107 = vsubps_avx(auVar104,auVar247);
            auVar123._0_4_ = auVar247._0_4_ + auVar107._0_4_ * fVar272;
            auVar123._4_4_ = auVar247._4_4_ + auVar107._4_4_ * fVar257;
            auVar123._8_4_ = auVar247._8_4_ + auVar107._8_4_ * fVar273;
            auVar123._12_4_ = auVar247._12_4_ + auVar107._12_4_ * fVar217;
            auVar123._16_4_ = auVar247._0_4_ + auVar107._0_4_ * fVar235;
            auVar123._20_4_ = auVar247._4_4_ + auVar107._4_4_ * fVar236;
            auVar123._24_4_ = auVar247._8_4_ + auVar107._8_4_ * fVar237;
            auVar123._28_4_ = auVar247._12_4_ + auVar107._12_4_;
            auVar119 = vsubps_avx(auVar197,auVar159);
            auVar160._0_4_ = auVar159._0_4_ + fVar272 * auVar119._0_4_;
            auVar160._4_4_ = auVar159._4_4_ + fVar257 * auVar119._4_4_;
            auVar160._8_4_ = auVar159._8_4_ + fVar273 * auVar119._8_4_;
            auVar160._12_4_ = auVar159._12_4_ + fVar217 * auVar119._12_4_;
            auVar160._16_4_ = auVar159._16_4_ + fVar235 * auVar119._16_4_;
            auVar160._20_4_ = auVar159._20_4_ + fVar236 * auVar119._20_4_;
            auVar160._24_4_ = auVar159._24_4_ + fVar237 * auVar119._24_4_;
            auVar160._28_4_ = auVar159._28_4_ + auVar119._28_4_;
            auVar119 = vsubps_avx(auVar123,auVar197);
            auVar124._0_4_ = auVar197._0_4_ + fVar272 * auVar119._0_4_;
            auVar124._4_4_ = auVar197._4_4_ + fVar257 * auVar119._4_4_;
            auVar124._8_4_ = auVar197._8_4_ + fVar273 * auVar119._8_4_;
            auVar124._12_4_ = auVar197._12_4_ + fVar217 * auVar119._12_4_;
            auVar124._16_4_ = auVar197._16_4_ + fVar235 * auVar119._16_4_;
            auVar124._20_4_ = auVar197._20_4_ + fVar236 * auVar119._20_4_;
            auVar124._24_4_ = auVar197._24_4_ + fVar237 * auVar119._24_4_;
            auVar124._28_4_ = auVar197._28_4_ + auVar119._28_4_;
            auVar119 = vsubps_avx(auVar124,auVar160);
            auVar266._0_4_ = auVar160._0_4_ + fVar272 * auVar119._0_4_;
            auVar266._4_4_ = auVar160._4_4_ + fVar257 * auVar119._4_4_;
            auVar266._8_4_ = auVar160._8_4_ + fVar273 * auVar119._8_4_;
            auVar266._12_4_ = auVar160._12_4_ + fVar217 * auVar119._12_4_;
            auVar270._16_4_ = auVar160._16_4_ + fVar235 * auVar119._16_4_;
            auVar270._0_16_ = auVar266;
            auVar270._20_4_ = auVar160._20_4_ + fVar236 * auVar119._20_4_;
            auVar270._24_4_ = auVar160._24_4_ + fVar237 * auVar119._24_4_;
            auVar270._28_4_ = auVar160._28_4_ + auVar197._28_4_;
            auVar239 = auVar270._16_16_;
            auVar139 = vshufps_avx(ZEXT416((uint)(fVar271 * 0.33333334)),
                                   ZEXT416((uint)(fVar271 * 0.33333334)),0);
            auVar225._0_4_ = auVar266._0_4_ + auVar139._0_4_ * auVar119._0_4_ * 3.0;
            auVar225._4_4_ = auVar266._4_4_ + auVar139._4_4_ * auVar119._4_4_ * 3.0;
            auVar225._8_4_ = auVar266._8_4_ + auVar139._8_4_ * auVar119._8_4_ * 3.0;
            auVar225._12_4_ = auVar266._12_4_ + auVar139._12_4_ * auVar119._12_4_ * 3.0;
            auVar193 = vshufpd_avx(auVar266,auVar266,3);
            auVar151 = vshufpd_avx(auVar239,auVar239,3);
            auVar107 = vsubps_avx(auVar193,auVar266);
            auVar199 = vsubps_avx(auVar151,auVar239);
            auVar105._0_4_ = auVar107._0_4_ + auVar199._0_4_;
            auVar105._4_4_ = auVar107._4_4_ + auVar199._4_4_;
            auVar105._8_4_ = auVar107._8_4_ + auVar199._8_4_;
            auVar105._12_4_ = auVar107._12_4_ + auVar199._12_4_;
            auVar107 = vmovshdup_avx(auVar266);
            auVar199 = vmovshdup_avx(auVar225);
            auVar179 = vshufps_avx(auVar105,auVar105,0);
            auVar140 = vshufps_avx(auVar105,auVar105,0x55);
            fVar272 = auVar140._0_4_;
            fVar257 = auVar140._4_4_;
            fVar273 = auVar140._8_4_;
            fVar217 = auVar140._12_4_;
            fVar235 = auVar179._0_4_;
            fVar236 = auVar179._4_4_;
            fVar237 = auVar179._8_4_;
            fVar340 = auVar179._12_4_;
            auVar106._0_4_ = fVar235 * auVar266._0_4_ + auVar107._0_4_ * fVar272;
            auVar106._4_4_ = fVar236 * auVar266._4_4_ + auVar107._4_4_ * fVar257;
            auVar106._8_4_ = fVar237 * auVar266._8_4_ + auVar107._8_4_ * fVar273;
            auVar106._12_4_ = fVar340 * auVar266._12_4_ + auVar107._12_4_ * fVar217;
            auVar326._0_4_ = fVar235 * auVar225._0_4_ + auVar199._0_4_ * fVar272;
            auVar326._4_4_ = fVar236 * auVar225._4_4_ + auVar199._4_4_ * fVar257;
            auVar326._8_4_ = fVar237 * auVar225._8_4_ + auVar199._8_4_ * fVar273;
            auVar326._12_4_ = fVar340 * auVar225._12_4_ + auVar199._12_4_ * fVar217;
            auVar199 = vshufps_avx(auVar106,auVar106,0xe8);
            auVar179 = vshufps_avx(auVar326,auVar326,0xe8);
            auVar107 = vcmpps_avx(auVar199,auVar179,1);
            uVar71 = vextractps_avx(auVar107,0);
            auVar140 = auVar326;
            if ((uVar71 & 1) == 0) {
              auVar140 = auVar106;
            }
            auVar138._0_4_ = auVar139._0_4_ * auVar119._16_4_ * 3.0;
            auVar138._4_4_ = auVar139._4_4_ * auVar119._20_4_ * 3.0;
            auVar138._8_4_ = auVar139._8_4_ * auVar119._24_4_ * 3.0;
            auVar138._12_4_ = auVar139._12_4_ * 0.0;
            auVar274 = vsubps_avx(auVar239,auVar138);
            auVar139 = vmovshdup_avx(auVar274);
            auVar239 = vmovshdup_avx(auVar239);
            fVar341 = auVar274._0_4_;
            fVar342 = auVar274._4_4_;
            auVar248._0_4_ = fVar341 * fVar235 + auVar139._0_4_ * fVar272;
            auVar248._4_4_ = fVar342 * fVar236 + auVar139._4_4_ * fVar257;
            auVar248._8_4_ = auVar274._8_4_ * fVar237 + auVar139._8_4_ * fVar273;
            auVar248._12_4_ = auVar274._12_4_ * fVar340 + auVar139._12_4_ * fVar217;
            auVar368._0_4_ = fVar235 * auVar270._16_4_ + auVar239._0_4_ * fVar272;
            auVar368._4_4_ = fVar236 * auVar270._20_4_ + auVar239._4_4_ * fVar257;
            auVar368._8_4_ = fVar237 * auVar270._24_4_ + auVar239._8_4_ * fVar273;
            auVar368._12_4_ = fVar340 * auVar270._28_4_ + auVar239._12_4_ * fVar217;
            auVar239 = vshufps_avx(auVar248,auVar248,0xe8);
            auVar259 = vshufps_avx(auVar368,auVar368,0xe8);
            auVar139 = vcmpps_avx(auVar239,auVar259,1);
            uVar71 = vextractps_avx(auVar139,0);
            auVar275 = auVar368;
            if ((uVar71 & 1) == 0) {
              auVar275 = auVar248;
            }
            auVar140 = vmaxss_avx(auVar275,auVar140);
            auVar199 = vminps_avx(auVar199,auVar179);
            auVar179 = vminps_avx(auVar239,auVar259);
            auVar179 = vminps_avx(auVar199,auVar179);
            auVar107 = vshufps_avx(auVar107,auVar107,0x55);
            auVar107 = vblendps_avx(auVar107,auVar139,2);
            auVar139 = vpslld_avx(auVar107,0x1f);
            auVar107 = vshufpd_avx(auVar326,auVar326,1);
            auVar107 = vinsertps_avx(auVar107,auVar368,0x9c);
            auVar199 = vshufpd_avx(auVar106,auVar106,1);
            auVar199 = vinsertps_avx(auVar199,auVar248,0x9c);
            auVar107 = vblendvps_avx(auVar199,auVar107,auVar139);
            auVar199 = vmovshdup_avx(auVar107);
            auVar107 = vmaxss_avx(auVar199,auVar107);
            fVar273 = auVar179._0_4_;
            auVar199 = vmovshdup_avx(auVar179);
            fVar257 = auVar107._0_4_;
            fVar217 = auVar199._0_4_;
            fVar272 = auVar140._0_4_;
            if ((fVar273 < 0.0001) && (-0.0001 < fVar257)) break;
            if ((fVar217 < 0.0001 && -0.0001 < fVar272) || (fVar273 < 0.0001 && -0.0001 < fVar272))
            break;
            auVar139 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar107,1);
            auVar199 = vcmpps_avx(auVar199,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar199 = vandps_avx(auVar199,auVar139);
          } while ((auVar199 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar139 = vcmpps_avx(auVar179,_DAT_01f45a50,1);
          auVar199 = vcmpss_avx(auVar140,ZEXT416(0) << 0x20,1);
          auVar178._8_4_ = 0x3f800000;
          auVar178._0_8_ = 0x3f8000003f800000;
          auVar178._12_4_ = 0x3f800000;
          auVar226._8_4_ = 0xbf800000;
          auVar226._0_8_ = 0xbf800000bf800000;
          auVar226._12_4_ = 0xbf800000;
          auVar199 = vblendvps_avx(auVar178,auVar226,auVar199);
          auVar139 = vblendvps_avx(auVar178,auVar226,auVar139);
          auVar179 = vcmpss_avx(auVar139,auVar199,4);
          auVar179 = vpshufd_avx(ZEXT416(auVar179._0_4_ & 1),0x50);
          auVar179 = vpslld_avx(auVar179,0x1f);
          auVar179 = vpsrad_avx(auVar179,0x1f);
          auVar179 = vpandn_avx(auVar179,_DAT_01f7afb0);
          auVar140 = vmovshdup_avx(auVar139);
          fVar235 = auVar140._0_4_;
          if ((auVar139._0_4_ != fVar235) || (NAN(auVar139._0_4_) || NAN(fVar235))) {
            if ((fVar217 != fVar273) || (NAN(fVar217) || NAN(fVar273))) {
              fVar273 = -fVar273 / (fVar217 - fVar273);
              auVar139 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar273) * 0.0 + fVar273)));
            }
            else {
              auVar139 = ZEXT816(0x3f80000000000000);
              if ((fVar273 != 0.0) || (NAN(fVar273))) {
                auVar139 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar239 = vcmpps_avx(auVar179,auVar139,1);
            auVar140 = vblendps_avx(auVar179,auVar139,2);
            auVar139 = vblendps_avx(auVar139,auVar179,2);
            auVar179 = vblendvps_avx(auVar139,auVar140,auVar239);
          }
          auVar107 = vcmpss_avx(auVar107,ZEXT416(0) << 0x20,1);
          auVar180._8_4_ = 0x3f800000;
          auVar180._0_8_ = 0x3f8000003f800000;
          auVar180._12_4_ = 0x3f800000;
          auVar227._8_4_ = 0xbf800000;
          auVar227._0_8_ = 0xbf800000bf800000;
          auVar227._12_4_ = 0xbf800000;
          auVar107 = vblendvps_avx(auVar180,auVar227,auVar107);
          fVar273 = auVar107._0_4_;
          if ((auVar199._0_4_ != fVar273) || (NAN(auVar199._0_4_) || NAN(fVar273))) {
            if ((fVar257 != fVar272) || (NAN(fVar257) || NAN(fVar272))) {
              fVar272 = -fVar272 / (fVar257 - fVar272);
              auVar107 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar272) * 0.0 + fVar272)));
            }
            else {
              auVar107 = ZEXT816(0x3f80000000000000);
              if ((fVar272 != 0.0) || (NAN(fVar272))) {
                auVar107 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar139 = vcmpps_avx(auVar179,auVar107,1);
            auVar199 = vblendps_avx(auVar179,auVar107,2);
            auVar107 = vblendps_avx(auVar107,auVar179,2);
            auVar179 = vblendvps_avx(auVar107,auVar199,auVar139);
          }
          if ((fVar235 != fVar273) || (NAN(fVar235) || NAN(fVar273))) {
            auVar108._8_4_ = 0x3f800000;
            auVar108._0_8_ = 0x3f8000003f800000;
            auVar108._12_4_ = 0x3f800000;
            auVar107 = vcmpps_avx(auVar179,auVar108,1);
            auVar199 = vinsertps_avx(auVar179,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar181._4_12_ = auVar179._4_12_;
            auVar181._0_4_ = 0x3f800000;
            auVar179 = vblendvps_avx(auVar181,auVar199,auVar107);
          }
          auVar107 = vcmpps_avx(auVar179,_DAT_01f46740,1);
          auVar60._12_4_ = 0;
          auVar60._0_12_ = auVar179._4_12_;
          auVar199 = vinsertps_avx(auVar179,ZEXT416(0x3f800000),0x10);
          auVar107 = vblendvps_avx(auVar199,auVar60 << 0x20,auVar107);
          auVar199 = vmovshdup_avx(auVar107);
        } while (auVar199._0_4_ < auVar107._0_4_);
        auVar109._0_4_ = auVar107._0_4_ + -0.1;
        auVar109._4_4_ = auVar107._4_4_ + 0.1;
        auVar109._8_4_ = auVar107._8_4_ + 0.0;
        auVar109._12_4_ = auVar107._12_4_ + 0.0;
        auVar139 = vshufpd_avx(auVar225,auVar225,3);
        auVar267._8_8_ = 0x3f80000000000000;
        auVar267._0_8_ = 0x3f80000000000000;
        auVar107 = vcmpps_avx(auVar109,auVar267,1);
        auVar58._12_4_ = 0;
        auVar58._0_12_ = auVar109._4_12_;
        auVar199 = vinsertps_avx(auVar109,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar107 = vblendvps_avx(auVar199,auVar58 << 0x20,auVar107);
        auVar199 = vshufpd_avx(auVar274,auVar274,3);
        auVar179 = vshufps_avx(auVar107,auVar107,0x50);
        auVar268._8_4_ = 0x3f800000;
        auVar268._0_8_ = 0x3f8000003f800000;
        auVar268._12_4_ = 0x3f800000;
        auVar140 = vsubps_avx(auVar268,auVar179);
        local_468 = auVar193._0_4_;
        fStack_464 = auVar193._4_4_;
        fStack_460 = auVar193._8_4_;
        fStack_45c = auVar193._12_4_;
        fVar272 = auVar179._0_4_;
        fVar257 = auVar179._4_4_;
        fVar273 = auVar179._8_4_;
        fVar217 = auVar179._12_4_;
        local_568._0_4_ = auVar151._0_4_;
        local_568._4_4_ = auVar151._4_4_;
        fStack_560 = auVar151._8_4_;
        fStack_55c = auVar151._12_4_;
        fVar235 = auVar140._0_4_;
        fVar236 = auVar140._4_4_;
        fVar237 = auVar140._8_4_;
        fVar340 = auVar140._12_4_;
        auVar110._0_4_ = fVar272 * local_468 + fVar235 * auVar266._0_4_;
        auVar110._4_4_ = fVar257 * fStack_464 + fVar236 * auVar266._4_4_;
        auVar110._8_4_ = fVar273 * fStack_460 + fVar237 * auVar266._0_4_;
        auVar110._12_4_ = fVar217 * fStack_45c + fVar340 * auVar266._4_4_;
        auVar249._0_4_ = auVar139._0_4_ * fVar272 + fVar235 * auVar225._0_4_;
        auVar249._4_4_ = auVar139._4_4_ * fVar257 + fVar236 * auVar225._4_4_;
        auVar249._8_4_ = auVar139._8_4_ * fVar273 + fVar237 * auVar225._0_4_;
        auVar249._12_4_ = auVar139._12_4_ * fVar217 + fVar340 * auVar225._4_4_;
        auVar280._0_4_ = auVar199._0_4_ * fVar272 + fVar235 * fVar341;
        auVar280._4_4_ = auVar199._4_4_ * fVar257 + fVar236 * fVar342;
        auVar280._8_4_ = auVar199._8_4_ * fVar273 + fVar237 * fVar341;
        auVar280._12_4_ = auVar199._12_4_ * fVar217 + fVar340 * fVar342;
        auVar313._0_4_ = fVar272 * (float)local_568._0_4_ + fVar235 * auVar270._16_4_;
        auVar313._4_4_ = fVar257 * (float)local_568._4_4_ + fVar236 * auVar270._20_4_;
        auVar313._8_4_ = fVar273 * fStack_560 + fVar237 * auVar270._16_4_;
        auVar313._12_4_ = fVar217 * fStack_55c + fVar340 * auVar270._20_4_;
        auVar151 = vsubps_avx(auVar268,auVar107);
        auVar199 = vmovshdup_avx(auVar325);
        auVar193 = vmovsldup_avx(auVar325);
        auVar269._0_4_ = auVar151._0_4_ * auVar193._0_4_ + auVar107._0_4_ * auVar199._0_4_;
        auVar269._4_4_ = auVar151._4_4_ * auVar193._4_4_ + auVar107._4_4_ * auVar199._4_4_;
        auVar269._8_4_ = auVar151._8_4_ * auVar193._8_4_ + auVar107._8_4_ * auVar199._8_4_;
        auVar269._12_4_ = auVar151._12_4_ * auVar193._12_4_ + auVar107._12_4_ * auVar199._12_4_;
        auVar274 = vmovshdup_avx(auVar269);
        auVar107 = vsubps_avx(auVar249,auVar110);
        auVar182._0_4_ = auVar107._0_4_ * 3.0;
        auVar182._4_4_ = auVar107._4_4_ * 3.0;
        auVar182._8_4_ = auVar107._8_4_ * 3.0;
        auVar182._12_4_ = auVar107._12_4_ * 3.0;
        auVar107 = vsubps_avx(auVar280,auVar249);
        auVar213._0_4_ = auVar107._0_4_ * 3.0;
        auVar213._4_4_ = auVar107._4_4_ * 3.0;
        auVar213._8_4_ = auVar107._8_4_ * 3.0;
        auVar213._12_4_ = auVar107._12_4_ * 3.0;
        auVar107 = vsubps_avx(auVar313,auVar280);
        auVar290._0_4_ = auVar107._0_4_ * 3.0;
        auVar290._4_4_ = auVar107._4_4_ * 3.0;
        auVar290._8_4_ = auVar107._8_4_ * 3.0;
        auVar290._12_4_ = auVar107._12_4_ * 3.0;
        auVar199 = vminps_avx(auVar213,auVar290);
        auVar107 = vmaxps_avx(auVar213,auVar290);
        auVar199 = vminps_avx(auVar182,auVar199);
        auVar107 = vmaxps_avx(auVar182,auVar107);
        auVar193 = vshufpd_avx(auVar199,auVar199,3);
        auVar151 = vshufpd_avx(auVar107,auVar107,3);
        auVar199 = vminps_avx(auVar199,auVar193);
        auVar107 = vmaxps_avx(auVar107,auVar151);
        auVar193 = vshufps_avx(ZEXT416((uint)(1.0 / fVar271)),ZEXT416((uint)(1.0 / fVar271)),0);
        auVar291._0_4_ = auVar193._0_4_ * auVar199._0_4_;
        auVar291._4_4_ = auVar193._4_4_ * auVar199._4_4_;
        auVar291._8_4_ = auVar193._8_4_ * auVar199._8_4_;
        auVar291._12_4_ = auVar193._12_4_ * auVar199._12_4_;
        auVar299._0_4_ = auVar193._0_4_ * auVar107._0_4_;
        auVar299._4_4_ = auVar193._4_4_ * auVar107._4_4_;
        auVar299._8_4_ = auVar193._8_4_ * auVar107._8_4_;
        auVar299._12_4_ = auVar193._12_4_ * auVar107._12_4_;
        auVar140 = ZEXT416((uint)(1.0 / (auVar274._0_4_ - auVar269._0_4_)));
        auVar107 = vshufpd_avx(auVar110,auVar110,3);
        auVar199 = vshufpd_avx(auVar249,auVar249,3);
        auVar193 = vshufpd_avx(auVar280,auVar280,3);
        auVar151 = vshufpd_avx(auVar313,auVar313,3);
        auVar107 = vsubps_avx(auVar107,auVar110);
        auVar139 = vsubps_avx(auVar199,auVar249);
        auVar179 = vsubps_avx(auVar193,auVar280);
        auVar151 = vsubps_avx(auVar151,auVar313);
        auVar199 = vminps_avx(auVar107,auVar139);
        auVar107 = vmaxps_avx(auVar107,auVar139);
        auVar193 = vminps_avx(auVar179,auVar151);
        auVar193 = vminps_avx(auVar199,auVar193);
        auVar199 = vmaxps_avx(auVar179,auVar151);
        auVar107 = vmaxps_avx(auVar107,auVar199);
        auVar199 = vshufps_avx(auVar140,auVar140,0);
        auVar350._0_4_ = auVar199._0_4_ * auVar193._0_4_;
        auVar350._4_4_ = auVar199._4_4_ * auVar193._4_4_;
        auVar350._8_4_ = auVar199._8_4_ * auVar193._8_4_;
        auVar350._12_4_ = auVar199._12_4_ * auVar193._12_4_;
        auVar358._0_4_ = auVar199._0_4_ * auVar107._0_4_;
        auVar358._4_4_ = auVar199._4_4_ * auVar107._4_4_;
        auVar358._8_4_ = auVar199._8_4_ * auVar107._8_4_;
        auVar358._12_4_ = auVar199._12_4_ * auVar107._12_4_;
        auVar107 = vmovsldup_avx(auVar269);
        auVar314._4_12_ = auVar107._4_12_;
        auVar314._0_4_ = fVar256;
        auVar327._4_12_ = auVar269._4_12_;
        auVar327._0_4_ = fVar255;
        auVar214._0_4_ = (fVar256 + fVar255) * 0.5;
        auVar214._4_4_ = (auVar107._4_4_ + auVar269._4_4_) * 0.5;
        auVar214._8_4_ = (auVar107._8_4_ + auVar269._8_4_) * 0.5;
        auVar214._12_4_ = (auVar107._12_4_ + auVar269._12_4_) * 0.5;
        auVar107 = vshufps_avx(auVar214,auVar214,0);
        local_238 = auVar210._0_4_;
        fStack_234 = auVar210._4_4_;
        fStack_230 = auVar210._8_4_;
        fStack_22c = auVar210._12_4_;
        fVar272 = auVar107._0_4_;
        fVar257 = auVar107._4_4_;
        fVar273 = auVar107._8_4_;
        fVar217 = auVar107._12_4_;
        p00.field_0.i[0] = auVar17._0_4_;
        p00.field_0.i[1] = auVar17._4_4_;
        p00.field_0.i[2] = auVar17._8_4_;
        p00.field_0.i[3] = auVar17._12_4_;
        auVar141._0_4_ = fVar272 * local_238 + p00.field_0.v[0];
        auVar141._4_4_ = fVar257 * fStack_234 + p00.field_0.v[1];
        auVar141._8_4_ = fVar273 * fStack_230 + p00.field_0.v[2];
        auVar141._12_4_ = fVar217 * fStack_22c + p00.field_0.v[3];
        local_248 = auVar165._0_4_;
        fStack_244 = auVar165._4_4_;
        fStack_240 = auVar165._8_4_;
        fStack_23c = auVar165._12_4_;
        p01.field_0.i[0] = auVar18._0_4_;
        p01.field_0.i[1] = auVar18._4_4_;
        p01.field_0.i[2] = auVar18._8_4_;
        p01.field_0.i[3] = auVar18._12_4_;
        auVar183._0_4_ = fVar272 * local_248 + p01.field_0.v[0];
        auVar183._4_4_ = fVar257 * fStack_244 + p01.field_0.v[1];
        auVar183._8_4_ = fVar273 * fStack_240 + p01.field_0.v[2];
        auVar183._12_4_ = fVar217 * fStack_23c + p01.field_0.v[3];
        local_258 = auVar83._0_4_;
        fStack_254 = auVar83._4_4_;
        fStack_250 = auVar83._8_4_;
        fStack_24c = auVar83._12_4_;
        p02.field_0.i[0] = auVar132._0_4_;
        p02.field_0.i[1] = auVar132._4_4_;
        p02.field_0.i[2] = auVar132._8_4_;
        p02.field_0.i[3] = auVar132._12_4_;
        auVar250._0_4_ = fVar272 * local_258 + p02.field_0.v[0];
        auVar250._4_4_ = fVar257 * fStack_254 + p02.field_0.v[1];
        auVar250._8_4_ = fVar273 * fStack_250 + p02.field_0.v[2];
        auVar250._12_4_ = fVar217 * fStack_24c + p02.field_0.v[3];
        auVar107 = vsubps_avx(auVar183,auVar141);
        auVar142._0_4_ = auVar141._0_4_ + fVar272 * auVar107._0_4_;
        auVar142._4_4_ = auVar141._4_4_ + fVar257 * auVar107._4_4_;
        auVar142._8_4_ = auVar141._8_4_ + fVar273 * auVar107._8_4_;
        auVar142._12_4_ = auVar141._12_4_ + fVar217 * auVar107._12_4_;
        auVar107 = vsubps_avx(auVar250,auVar183);
        auVar184._0_4_ = auVar183._0_4_ + fVar272 * auVar107._0_4_;
        auVar184._4_4_ = auVar183._4_4_ + fVar257 * auVar107._4_4_;
        auVar184._8_4_ = auVar183._8_4_ + fVar273 * auVar107._8_4_;
        auVar184._12_4_ = auVar183._12_4_ + fVar217 * auVar107._12_4_;
        auVar107 = vsubps_avx(auVar184,auVar142);
        fVar272 = auVar142._0_4_ + fVar272 * auVar107._0_4_;
        fVar257 = auVar142._4_4_ + fVar257 * auVar107._4_4_;
        auVar111._0_8_ = CONCAT44(fVar257,fVar272);
        auVar111._8_4_ = auVar142._8_4_ + fVar273 * auVar107._8_4_;
        auVar111._12_4_ = auVar142._12_4_ + fVar217 * auVar107._12_4_;
        fVar273 = auVar107._0_4_ * 3.0;
        fVar217 = auVar107._4_4_ * 3.0;
        auVar143._0_8_ = CONCAT44(fVar217,fVar273);
        auVar143._8_4_ = auVar107._8_4_ * 3.0;
        auVar143._12_4_ = auVar107._12_4_ * 3.0;
        auVar185._8_8_ = auVar111._0_8_;
        auVar185._0_8_ = auVar111._0_8_;
        auVar107 = vshufpd_avx(auVar111,auVar111,3);
        auVar199 = vshufps_avx(auVar214,auVar214,0x55);
        auVar179 = vsubps_avx(auVar107,auVar185);
        auVar339._0_4_ = auVar179._0_4_ * auVar199._0_4_ + fVar272;
        auVar339._4_4_ = auVar179._4_4_ * auVar199._4_4_ + fVar257;
        auVar339._8_4_ = auVar179._8_4_ * auVar199._8_4_ + fVar272;
        auVar339._12_4_ = auVar179._12_4_ * auVar199._12_4_ + fVar257;
        auVar186._8_8_ = auVar143._0_8_;
        auVar186._0_8_ = auVar143._0_8_;
        auVar107 = vshufpd_avx(auVar143,auVar143,1);
        auVar107 = vsubps_avx(auVar107,auVar186);
        auVar144._0_4_ = auVar107._0_4_ * auVar199._0_4_ + fVar273;
        auVar144._4_4_ = auVar107._4_4_ * auVar199._4_4_ + fVar217;
        auVar144._8_4_ = auVar107._8_4_ * auVar199._8_4_ + fVar273;
        auVar144._12_4_ = auVar107._12_4_ * auVar199._12_4_ + fVar217;
        auVar199 = vmovshdup_avx(auVar144);
        auVar251._0_8_ = auVar199._0_8_ ^ 0x8000000080000000;
        auVar251._8_4_ = auVar199._8_4_ ^ 0x80000000;
        auVar251._12_4_ = auVar199._12_4_ ^ 0x80000000;
        auVar193 = vmovshdup_avx(auVar179);
        auVar107 = vunpcklps_avx(auVar193,auVar251);
        auVar151 = vshufps_avx(auVar107,auVar251,4);
        auVar112._0_8_ = auVar179._0_8_ ^ 0x8000000080000000;
        auVar112._8_4_ = -auVar179._8_4_;
        auVar112._12_4_ = -auVar179._12_4_;
        auVar107 = vmovlhps_avx(auVar112,auVar144);
        auVar139 = vshufps_avx(auVar107,auVar144,8);
        auVar107 = ZEXT416((uint)(auVar144._0_4_ * auVar193._0_4_ - auVar179._0_4_ * auVar199._0_4_)
                          );
        auVar199 = vshufps_avx(auVar107,auVar107,0);
        auVar107 = vdivps_avx(auVar151,auVar199);
        auVar199 = vdivps_avx(auVar139,auVar199);
        auVar139 = vinsertps_avx(auVar291,auVar350,0x1c);
        auVar179 = vinsertps_avx(auVar299,auVar358,0x1c);
        auVar140 = vinsertps_avx(auVar350,auVar291,0x4c);
        auVar239 = vinsertps_avx(auVar358,auVar299,0x4c);
        auVar193 = vmovsldup_avx(auVar107);
        auVar187._0_4_ = auVar193._0_4_ * auVar139._0_4_;
        auVar187._4_4_ = auVar193._4_4_ * auVar139._4_4_;
        auVar187._8_4_ = auVar193._8_4_ * auVar139._8_4_;
        auVar187._12_4_ = auVar193._12_4_ * auVar139._12_4_;
        auVar145._0_4_ = auVar179._0_4_ * auVar193._0_4_;
        auVar145._4_4_ = auVar179._4_4_ * auVar193._4_4_;
        auVar145._8_4_ = auVar179._8_4_ * auVar193._8_4_;
        auVar145._12_4_ = auVar179._12_4_ * auVar193._12_4_;
        auVar151 = vminps_avx(auVar187,auVar145);
        auVar193 = vmaxps_avx(auVar145,auVar187);
        auVar259 = vmovsldup_avx(auVar199);
        auVar359._0_4_ = auVar140._0_4_ * auVar259._0_4_;
        auVar359._4_4_ = auVar140._4_4_ * auVar259._4_4_;
        auVar359._8_4_ = auVar140._8_4_ * auVar259._8_4_;
        auVar359._12_4_ = auVar140._12_4_ * auVar259._12_4_;
        auVar188._0_4_ = auVar239._0_4_ * auVar259._0_4_;
        auVar188._4_4_ = auVar239._4_4_ * auVar259._4_4_;
        auVar188._8_4_ = auVar239._8_4_ * auVar259._8_4_;
        auVar188._12_4_ = auVar239._12_4_ * auVar259._12_4_;
        auVar259 = vminps_avx(auVar359,auVar188);
        auVar228._0_4_ = auVar151._0_4_ + auVar259._0_4_;
        auVar228._4_4_ = auVar151._4_4_ + auVar259._4_4_;
        auVar228._8_4_ = auVar151._8_4_ + auVar259._8_4_;
        auVar228._12_4_ = auVar151._12_4_ + auVar259._12_4_;
        auVar151 = vmaxps_avx(auVar188,auVar359);
        auVar259 = vsubps_avx(auVar314,auVar214);
        auVar275 = vsubps_avx(auVar327,auVar214);
        auVar146._0_4_ = auVar193._0_4_ + auVar151._0_4_;
        auVar146._4_4_ = auVar193._4_4_ + auVar151._4_4_;
        auVar146._8_4_ = auVar193._8_4_ + auVar151._8_4_;
        auVar146._12_4_ = auVar193._12_4_ + auVar151._12_4_;
        auVar189._8_8_ = 0x3f800000;
        auVar189._0_8_ = 0x3f800000;
        auVar193 = vsubps_avx(auVar189,auVar146);
        auVar151 = vsubps_avx(auVar189,auVar228);
        fVar237 = auVar259._0_4_;
        auVar229._0_4_ = fVar237 * auVar193._0_4_;
        fVar340 = auVar259._4_4_;
        auVar229._4_4_ = fVar340 * auVar193._4_4_;
        fVar341 = auVar259._8_4_;
        auVar229._8_4_ = fVar341 * auVar193._8_4_;
        fVar342 = auVar259._12_4_;
        auVar229._12_4_ = fVar342 * auVar193._12_4_;
        fVar273 = auVar275._0_4_;
        auVar147._0_4_ = fVar273 * auVar193._0_4_;
        fVar217 = auVar275._4_4_;
        auVar147._4_4_ = fVar217 * auVar193._4_4_;
        fVar235 = auVar275._8_4_;
        auVar147._8_4_ = fVar235 * auVar193._8_4_;
        fVar236 = auVar275._12_4_;
        auVar147._12_4_ = fVar236 * auVar193._12_4_;
        auVar315._0_4_ = fVar237 * auVar151._0_4_;
        auVar315._4_4_ = fVar340 * auVar151._4_4_;
        auVar315._8_4_ = fVar341 * auVar151._8_4_;
        auVar315._12_4_ = fVar342 * auVar151._12_4_;
        auVar190._0_4_ = fVar273 * auVar151._0_4_;
        auVar190._4_4_ = fVar217 * auVar151._4_4_;
        auVar190._8_4_ = fVar235 * auVar151._8_4_;
        auVar190._12_4_ = fVar236 * auVar151._12_4_;
        auVar193 = vminps_avx(auVar229,auVar315);
        auVar151 = vminps_avx(auVar147,auVar190);
        auVar259 = vminps_avx(auVar193,auVar151);
        auVar193 = vmaxps_avx(auVar315,auVar229);
        auVar151 = vmaxps_avx(auVar190,auVar147);
        auVar275 = vshufps_avx(auVar214,auVar214,0x54);
        auVar151 = vmaxps_avx(auVar151,auVar193);
        auVar282 = vshufps_avx(auVar339,auVar339,0);
        auVar283 = vshufps_avx(auVar339,auVar339,0x55);
        auVar193 = vhaddps_avx(auVar259,auVar259);
        auVar151 = vhaddps_avx(auVar151,auVar151);
        auVar215._0_4_ = auVar282._0_4_ * auVar107._0_4_ + auVar283._0_4_ * auVar199._0_4_;
        auVar215._4_4_ = auVar282._4_4_ * auVar107._4_4_ + auVar283._4_4_ * auVar199._4_4_;
        auVar215._8_4_ = auVar282._8_4_ * auVar107._8_4_ + auVar283._8_4_ * auVar199._8_4_;
        auVar215._12_4_ = auVar282._12_4_ * auVar107._12_4_ + auVar283._12_4_ * auVar199._12_4_;
        auVar259 = vsubps_avx(auVar275,auVar215);
        fVar272 = auVar259._0_4_ + auVar193._0_4_;
        fVar257 = auVar259._0_4_ + auVar151._0_4_;
        auVar193 = vmaxss_avx(ZEXT416((uint)fVar256),ZEXT416((uint)fVar272));
        auVar151 = vminss_avx(ZEXT416((uint)fVar257),ZEXT416((uint)fVar255));
      } while (auVar151._0_4_ < auVar193._0_4_);
      auVar193 = vmovshdup_avx(auVar107);
      auVar113._0_4_ = auVar193._0_4_ * auVar139._0_4_;
      auVar113._4_4_ = auVar193._4_4_ * auVar139._4_4_;
      auVar113._8_4_ = auVar193._8_4_ * auVar139._8_4_;
      auVar113._12_4_ = auVar193._12_4_ * auVar139._12_4_;
      auVar148._0_4_ = auVar179._0_4_ * auVar193._0_4_;
      auVar148._4_4_ = auVar179._4_4_ * auVar193._4_4_;
      auVar148._8_4_ = auVar179._8_4_ * auVar193._8_4_;
      auVar148._12_4_ = auVar179._12_4_ * auVar193._12_4_;
      auVar151 = vminps_avx(auVar113,auVar148);
      auVar193 = vmaxps_avx(auVar148,auVar113);
      auVar139 = vmovshdup_avx(auVar199);
      auVar230._0_4_ = auVar140._0_4_ * auVar139._0_4_;
      auVar230._4_4_ = auVar140._4_4_ * auVar139._4_4_;
      auVar230._8_4_ = auVar140._8_4_ * auVar139._8_4_;
      auVar230._12_4_ = auVar140._12_4_ * auVar139._12_4_;
      auVar149._0_4_ = auVar239._0_4_ * auVar139._0_4_;
      auVar149._4_4_ = auVar239._4_4_ * auVar139._4_4_;
      auVar149._8_4_ = auVar239._8_4_ * auVar139._8_4_;
      auVar149._12_4_ = auVar239._12_4_ * auVar139._12_4_;
      auVar139 = vminps_avx(auVar230,auVar149);
      auVar191._0_4_ = auVar151._0_4_ + auVar139._0_4_;
      auVar191._4_4_ = auVar151._4_4_ + auVar139._4_4_;
      auVar191._8_4_ = auVar151._8_4_ + auVar139._8_4_;
      auVar191._12_4_ = auVar151._12_4_ + auVar139._12_4_;
      auVar151 = vmaxps_avx(auVar149,auVar230);
      auVar114._0_4_ = auVar193._0_4_ + auVar151._0_4_;
      auVar114._4_4_ = auVar193._4_4_ + auVar151._4_4_;
      auVar114._8_4_ = auVar193._8_4_ + auVar151._8_4_;
      auVar114._12_4_ = auVar193._12_4_ + auVar151._12_4_;
      auVar193 = vsubps_avx(auVar267,auVar114);
      auVar151 = vsubps_avx(auVar267,auVar191);
      auVar192._0_4_ = fVar237 * auVar193._0_4_;
      auVar192._4_4_ = fVar340 * auVar193._4_4_;
      auVar192._8_4_ = fVar341 * auVar193._8_4_;
      auVar192._12_4_ = fVar342 * auVar193._12_4_;
      auVar231._0_4_ = fVar237 * auVar151._0_4_;
      auVar231._4_4_ = fVar340 * auVar151._4_4_;
      auVar231._8_4_ = fVar341 * auVar151._8_4_;
      auVar231._12_4_ = fVar342 * auVar151._12_4_;
      auVar115._0_4_ = fVar273 * auVar193._0_4_;
      auVar115._4_4_ = fVar217 * auVar193._4_4_;
      auVar115._8_4_ = fVar235 * auVar193._8_4_;
      auVar115._12_4_ = fVar236 * auVar193._12_4_;
      auVar150._0_4_ = fVar273 * auVar151._0_4_;
      auVar150._4_4_ = fVar217 * auVar151._4_4_;
      auVar150._8_4_ = fVar235 * auVar151._8_4_;
      auVar150._12_4_ = fVar236 * auVar151._12_4_;
      auVar193 = vminps_avx(auVar192,auVar231);
      auVar151 = vminps_avx(auVar115,auVar150);
      auVar193 = vminps_avx(auVar193,auVar151);
      auVar151 = vmaxps_avx(auVar231,auVar192);
      auVar139 = vmaxps_avx(auVar150,auVar115);
      auVar193 = vhaddps_avx(auVar193,auVar193);
      auVar151 = vmaxps_avx(auVar139,auVar151);
      auVar151 = vhaddps_avx(auVar151,auVar151);
      auVar139 = vmovshdup_avx(auVar259);
      auVar179 = ZEXT416((uint)(auVar139._0_4_ + auVar193._0_4_));
      auVar193 = vmaxss_avx(auVar269,auVar179);
      auVar139 = ZEXT416((uint)(auVar139._0_4_ + auVar151._0_4_));
      auVar151 = vminss_avx(auVar139,auVar274);
    } while (auVar151._0_4_ < auVar193._0_4_);
    bVar76 = 0;
    if ((fVar256 < fVar272) && (fVar257 < fVar255)) {
      auVar193 = vcmpps_avx(auVar139,auVar274,1);
      auVar151 = vcmpps_avx(auVar269,auVar179,1);
      auVar193 = vandps_avx(auVar151,auVar193);
      bVar76 = auVar193[0];
    }
    auVar292._8_4_ = 0x7fffffff;
    auVar292._0_8_ = 0x7fffffff7fffffff;
    auVar292._12_4_ = 0x7fffffff;
    p03.field_0.i[0] = auVar15._0_4_;
    p03.field_0.i[1] = auVar15._4_4_;
    p03.field_0.i[2] = auVar15._8_4_;
    p03.field_0.i[3] = auVar15._12_4_;
    if ((3 < (uint)uVar73 || fVar271 < 0.001) || (bVar76 & 1) != 0) {
      lVar75 = 0xc9;
      do {
        lVar75 = lVar75 + -1;
        if (lVar75 == 0) goto LAB_0091adc5;
        fVar271 = auVar259._0_4_;
        fVar255 = 1.0 - fVar271;
        auVar193 = ZEXT416((uint)(fVar255 * fVar255 * fVar255));
        auVar193 = vshufps_avx(auVar193,auVar193,0);
        auVar151 = ZEXT416((uint)(fVar271 * 3.0 * fVar255 * fVar255));
        auVar151 = vshufps_avx(auVar151,auVar151,0);
        auVar139 = ZEXT416((uint)(fVar255 * fVar271 * fVar271 * 3.0));
        auVar139 = vshufps_avx(auVar139,auVar139,0);
        auVar179 = ZEXT416((uint)(fVar271 * fVar271 * fVar271));
        auVar179 = vshufps_avx(auVar179,auVar179,0);
        fVar255 = p00.field_0.v[0] * auVar193._0_4_ +
                  p01.field_0.v[0] * auVar151._0_4_ +
                  p03.field_0.v[0] * auVar179._0_4_ + p02.field_0.v[0] * auVar139._0_4_;
        fVar271 = p00.field_0.v[1] * auVar193._4_4_ +
                  p01.field_0.v[1] * auVar151._4_4_ +
                  p03.field_0.v[1] * auVar179._4_4_ + p02.field_0.v[1] * auVar139._4_4_;
        auVar116._0_8_ = CONCAT44(fVar271,fVar255);
        auVar116._8_4_ =
             p00.field_0.v[2] * auVar193._8_4_ +
             p01.field_0.v[2] * auVar151._8_4_ +
             p03.field_0.v[2] * auVar179._8_4_ + p02.field_0.v[2] * auVar139._8_4_;
        auVar116._12_4_ =
             p00.field_0.v[3] * auVar193._12_4_ +
             p01.field_0.v[3] * auVar151._12_4_ +
             p03.field_0.v[3] * auVar179._12_4_ + p02.field_0.v[3] * auVar139._12_4_;
        auVar152._8_8_ = auVar116._0_8_;
        auVar152._0_8_ = auVar116._0_8_;
        auVar151 = vshufpd_avx(auVar116,auVar116,1);
        auVar193 = vmovshdup_avx(auVar259);
        auVar151 = vsubps_avx(auVar151,auVar152);
        auVar117._0_4_ = auVar193._0_4_ * auVar151._0_4_ + fVar255;
        auVar117._4_4_ = auVar193._4_4_ * auVar151._4_4_ + fVar271;
        auVar117._8_4_ = auVar193._8_4_ * auVar151._8_4_ + fVar255;
        auVar117._12_4_ = auVar193._12_4_ * auVar151._12_4_ + fVar271;
        auVar193 = vshufps_avx(auVar117,auVar117,0);
        auVar151 = vshufps_avx(auVar117,auVar117,0x55);
        auVar153._0_4_ = auVar107._0_4_ * auVar193._0_4_ + auVar199._0_4_ * auVar151._0_4_;
        auVar153._4_4_ = auVar107._4_4_ * auVar193._4_4_ + auVar199._4_4_ * auVar151._4_4_;
        auVar153._8_4_ = auVar107._8_4_ * auVar193._8_4_ + auVar199._8_4_ * auVar151._8_4_;
        auVar153._12_4_ = auVar107._12_4_ * auVar193._12_4_ + auVar199._12_4_ * auVar151._12_4_;
        auVar259 = vsubps_avx(auVar259,auVar153);
        auVar193 = vandps_avx(auVar292,auVar117);
        auVar151 = vshufps_avx(auVar193,auVar193,0xf5);
        auVar193 = vmaxss_avx(auVar151,auVar193);
      } while (fVar258 <= auVar193._0_4_);
      fVar255 = auVar259._0_4_;
      if ((0.0 <= fVar255) && (fVar255 <= 1.0)) {
        auVar107 = vmovshdup_avx(auVar259);
        fVar271 = auVar107._0_4_;
        if ((0.0 <= fVar271) && (fVar271 <= 1.0)) {
          auVar107 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                   ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar239 = vinsertps_avx(auVar107,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28
                                  );
          auVar107 = vdpps_avx(auVar239,auVar93,0x7f);
          auVar199 = vdpps_avx(auVar239,auVar20,0x7f);
          auVar193 = vdpps_avx(auVar239,auVar21,0x7f);
          auVar151 = vdpps_avx(auVar239,auVar84,0x7f);
          auVar139 = vdpps_avx(auVar239,auVar85,0x7f);
          auVar179 = vdpps_avx(auVar239,auVar126,0x7f);
          fVar217 = 1.0 - fVar271;
          auVar140 = vdpps_avx(auVar239,auVar16,0x7f);
          auVar239 = vdpps_avx(auVar239,auVar19,0x7f);
          fVar235 = 1.0 - fVar255;
          fVar256 = auVar259._4_4_;
          fVar272 = auVar259._8_4_;
          fVar257 = auVar259._12_4_;
          fVar273 = fVar235 * fVar255 * fVar255 * 3.0;
          auVar252._0_4_ = fVar255 * fVar255 * fVar255;
          auVar252._4_4_ = fVar256 * fVar256 * fVar256;
          auVar252._8_4_ = fVar272 * fVar272 * fVar272;
          auVar252._12_4_ = fVar257 * fVar257 * fVar257;
          fVar256 = fVar255 * 3.0 * fVar235 * fVar235;
          fVar272 = fVar235 * fVar235 * fVar235;
          fVar255 = (fVar217 * auVar107._0_4_ + fVar271 * auVar193._0_4_) * fVar272 +
                    (fVar217 * auVar199._0_4_ + fVar271 * auVar151._0_4_) * fVar256 +
                    fVar273 * (fVar217 * auVar140._0_4_ + fVar271 * auVar139._0_4_) +
                    auVar252._0_4_ * (auVar179._0_4_ * fVar271 + fVar217 * auVar239._0_4_);
          if ((fVar238 <= fVar255) && (fVar271 = *(float *)(ray + k * 4 + 0x80), fVar255 <= fVar271)
             ) {
            pGVar7 = (context->scene->geometries).items[uVar72].ptr;
            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              bVar80 = false;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (bVar80 = true, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              local_1c8 = vshufps_avx(auVar259,auVar259,0x55);
              auVar293._8_4_ = 0x3f800000;
              auVar293._0_8_ = 0x3f8000003f800000;
              auVar293._12_4_ = 0x3f800000;
              auVar107 = vsubps_avx(auVar293,local_1c8);
              fVar257 = local_1c8._0_4_;
              fVar217 = local_1c8._4_4_;
              fVar236 = local_1c8._8_4_;
              fVar237 = local_1c8._12_4_;
              fVar340 = auVar107._0_4_;
              fVar341 = auVar107._4_4_;
              fVar342 = auVar107._8_4_;
              fVar347 = auVar107._12_4_;
              auVar300._0_4_ = fVar257 * (float)local_418._0_4_ + fVar340 * (float)local_3e8._0_4_;
              auVar300._4_4_ = fVar217 * (float)local_418._4_4_ + fVar341 * (float)local_3e8._4_4_;
              auVar300._8_4_ = fVar236 * fStack_410 + fVar342 * fStack_3e0;
              auVar300._12_4_ = fVar237 * fStack_40c + fVar347 * fStack_3dc;
              auVar316._0_4_ = fVar257 * fVar162 + fVar340 * fVar161;
              auVar316._4_4_ = fVar217 * fVar321 + fVar341 * fVar163;
              auVar316._8_4_ = fVar236 * fVar309 + fVar342 * fVar333;
              auVar316._12_4_ = fVar237 * fVar320 + fVar347 * fVar319;
              auVar328._0_4_ = fVar257 * fVar81 + fVar340 * (float)local_3f8._0_4_;
              auVar328._4_4_ = fVar217 * fVar331 + fVar341 * (float)local_3f8._4_4_;
              auVar328._8_4_ = fVar236 * fVar318 + fVar342 * fStack_3f0;
              auVar328._12_4_ = fVar237 * fVar334 + fVar347 * fStack_3ec;
              auVar294._0_4_ = fVar257 * local_428 + fVar340 * (float)local_408._0_4_;
              auVar294._4_4_ = fVar217 * fStack_424 + fVar341 * (float)local_408._4_4_;
              auVar294._8_4_ = fVar236 * fStack_420 + fVar342 * fStack_400;
              auVar294._12_4_ = fVar237 * fStack_41c + fVar347 * fStack_3fc;
              auVar151 = vsubps_avx(auVar316,auVar300);
              auVar139 = vsubps_avx(auVar328,auVar316);
              auVar179 = vsubps_avx(auVar294,auVar328);
              local_1d8 = vshufps_avx(auVar259,auVar259,0);
              fVar257 = local_1d8._0_4_;
              fVar236 = local_1d8._4_4_;
              fVar237 = local_1d8._8_4_;
              fVar341 = local_1d8._12_4_;
              auVar107 = vshufps_avx(ZEXT416((uint)fVar235),ZEXT416((uint)fVar235),0);
              fVar217 = auVar107._0_4_;
              fVar235 = auVar107._4_4_;
              fVar340 = auVar107._8_4_;
              fVar342 = auVar107._12_4_;
              auVar107 = vshufps_avx(auVar252,auVar252,0);
              local_378 = auVar198._0_4_;
              fStack_374 = auVar198._4_4_;
              fStack_370 = auVar198._8_4_;
              fStack_36c = auVar198._12_4_;
              auVar199 = vshufps_avx(ZEXT416((uint)fVar273),ZEXT416((uint)fVar273),0);
              local_368 = auVar166._0_4_;
              fStack_364 = auVar166._4_4_;
              fStack_360 = auVar166._8_4_;
              fStack_35c = auVar166._12_4_;
              auVar193 = vshufps_avx(ZEXT416((uint)fVar256),ZEXT416((uint)fVar256),0);
              local_358 = auVar164._0_4_;
              fStack_354 = auVar164._4_4_;
              fStack_350 = auVar164._8_4_;
              fStack_34c = auVar164._12_4_;
              auVar232._0_4_ =
                   ((auVar139._0_4_ * fVar217 + auVar179._0_4_ * fVar257) * fVar257 +
                   (auVar151._0_4_ * fVar217 + auVar139._0_4_ * fVar257) * fVar217) * 3.0;
              auVar232._4_4_ =
                   ((auVar139._4_4_ * fVar235 + auVar179._4_4_ * fVar236) * fVar236 +
                   (auVar151._4_4_ * fVar235 + auVar139._4_4_ * fVar236) * fVar235) * 3.0;
              auVar232._8_4_ =
                   ((auVar139._8_4_ * fVar340 + auVar179._8_4_ * fVar237) * fVar237 +
                   (auVar151._8_4_ * fVar340 + auVar139._8_4_ * fVar237) * fVar340) * 3.0;
              auVar232._12_4_ =
                   ((auVar139._12_4_ * fVar342 + auVar179._12_4_ * fVar341) * fVar341 +
                   (auVar151._12_4_ * fVar342 + auVar139._12_4_ * fVar341) * fVar342) * 3.0;
              auVar151 = vshufps_avx(ZEXT416((uint)fVar272),ZEXT416((uint)fVar272),0);
              local_348 = auVar125._0_4_;
              fStack_344 = auVar125._4_4_;
              fStack_340 = auVar125._8_4_;
              fStack_33c = auVar125._12_4_;
              auVar154._0_4_ =
                   auVar151._0_4_ * local_348 +
                   auVar193._0_4_ * local_358 +
                   auVar107._0_4_ * local_378 + auVar199._0_4_ * local_368;
              auVar154._4_4_ =
                   auVar151._4_4_ * fStack_344 +
                   auVar193._4_4_ * fStack_354 +
                   auVar107._4_4_ * fStack_374 + auVar199._4_4_ * fStack_364;
              auVar154._8_4_ =
                   auVar151._8_4_ * fStack_340 +
                   auVar193._8_4_ * fStack_350 +
                   auVar107._8_4_ * fStack_370 + auVar199._8_4_ * fStack_360;
              auVar154._12_4_ =
                   auVar151._12_4_ * fStack_33c +
                   auVar193._12_4_ * fStack_34c +
                   auVar107._12_4_ * fStack_36c + auVar199._12_4_ * fStack_35c;
              auVar107 = vshufps_avx(auVar232,auVar232,0xc9);
              auVar194._0_4_ = auVar154._0_4_ * auVar107._0_4_;
              auVar194._4_4_ = auVar154._4_4_ * auVar107._4_4_;
              auVar194._8_4_ = auVar154._8_4_ * auVar107._8_4_;
              auVar194._12_4_ = auVar154._12_4_ * auVar107._12_4_;
              auVar107 = vshufps_avx(auVar154,auVar154,0xc9);
              auVar155._0_4_ = auVar232._0_4_ * auVar107._0_4_;
              auVar155._4_4_ = auVar232._4_4_ * auVar107._4_4_;
              auVar155._8_4_ = auVar232._8_4_ * auVar107._8_4_;
              auVar155._12_4_ = auVar232._12_4_ * auVar107._12_4_;
              auVar199 = vsubps_avx(auVar155,auVar194);
              auVar107 = vshufps_avx(auVar199,auVar199,0x55);
              local_208[0] = (RTCHitN)auVar107[0];
              local_208[1] = (RTCHitN)auVar107[1];
              local_208[2] = (RTCHitN)auVar107[2];
              local_208[3] = (RTCHitN)auVar107[3];
              local_208[4] = (RTCHitN)auVar107[4];
              local_208[5] = (RTCHitN)auVar107[5];
              local_208[6] = (RTCHitN)auVar107[6];
              local_208[7] = (RTCHitN)auVar107[7];
              local_208[8] = (RTCHitN)auVar107[8];
              local_208[9] = (RTCHitN)auVar107[9];
              local_208[10] = (RTCHitN)auVar107[10];
              local_208[0xb] = (RTCHitN)auVar107[0xb];
              local_208[0xc] = (RTCHitN)auVar107[0xc];
              local_208[0xd] = (RTCHitN)auVar107[0xd];
              local_208[0xe] = (RTCHitN)auVar107[0xe];
              local_208[0xf] = (RTCHitN)auVar107[0xf];
              local_1f8 = vshufps_avx(auVar199,auVar199,0xaa);
              local_1e8 = vshufps_avx(auVar199,auVar199,0);
              local_338 = auVar95._0_8_;
              uStack_330 = auVar95._8_8_;
              local_1b8 = local_338;
              uStack_1b0 = uStack_330;
              local_1a8 = auVar94;
              vcmpps_avx(ZEXT1632(auVar94),ZEXT1632(auVar94),0xf);
              uStack_194 = context->user->instID[0];
              local_198 = uStack_194;
              uStack_190 = uStack_194;
              uStack_18c = uStack_194;
              uStack_188 = context->user->instPrimID[0];
              uStack_184 = uStack_188;
              uStack_180 = uStack_188;
              uStack_17c = uStack_188;
              *(float *)(ray + k * 4 + 0x80) = fVar255;
              local_448 = *local_438;
              args.valid = (int *)local_448;
              args.geometryUserPtr = pGVar7->userPtr;
              args.context = context->user;
              args.ray = (RTCRayN *)ray;
              args.hit = local_208;
              args.N = 4;
              if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar7->occlusionFilterN)(&args);
              }
              if (local_448 == (undefined1  [16])0x0) {
                auVar107 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar107 = auVar107 ^ _DAT_01f46b70;
              }
              else {
                p_Var10 = context->args->filter;
                if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var10)(&args);
                }
                auVar199 = vpcmpeqd_avx(local_448,_DAT_01f45a50);
                auVar107 = auVar199 ^ _DAT_01f46b70;
                auVar195._8_4_ = 0xff800000;
                auVar195._0_8_ = 0xff800000ff800000;
                auVar195._12_4_ = 0xff800000;
                auVar199 = vblendvps_avx(auVar195,*(undefined1 (*) [16])(args.ray + 0x80),auVar199);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar199;
              }
              auVar156._8_8_ = 0x100000001;
              auVar156._0_8_ = 0x100000001;
              bVar80 = (auVar156 & auVar107) != (undefined1  [16])0x0;
              if (!bVar80) {
                *(float *)(ray + k * 4 + 0x80) = fVar271;
              }
            }
            bVar78 = (bool)(bVar78 | bVar80);
          }
        }
      }
      goto LAB_0091adc5;
    }
    auVar107 = vinsertps_avx(ZEXT416((uint)fVar256),ZEXT416((uint)fVar255),0x10);
    auVar369 = ZEXT1664(auVar107);
    auVar330 = ZEXT1664(auVar269);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }